

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::Eltwise_x86_fma::forward
          (Eltwise_x86_fma *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [12];
  undefined1 auVar27 [24];
  ulong uVar28;
  size_type sVar29;
  float *pfVar30;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  bool bVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  __m128 _p1_15;
  __m128 _p_15;
  __m256 _p1_14;
  __m256 _p_14;
  int i_7;
  float *outptr_7;
  float *ptr_7;
  int q_7;
  Mat *bottom_blob2_3;
  size_t b_3;
  __m128 _p1_13;
  __m128 _p_13;
  __m256 _p1_12;
  __m256 _p_12;
  int i_6;
  float *outptr_6;
  float *ptr1_3;
  float *ptr_6;
  int q_6;
  Mat *bottom_blob1_3;
  __m128 _p_11;
  __m128 _p1_11;
  __m128 _coeff;
  __m256 _p1_10;
  __m256 _p_10;
  __m256 _coeff_avx;
  int i_5;
  float coeff;
  float *outptr_5;
  float *ptr_5;
  int q_5;
  Mat *bottom_blob2_2;
  size_t b_2;
  __m128 _p1_9;
  __m128 _p_9;
  __m128 _coeff1;
  __m128 _coeff0;
  __m256 _p1_8;
  __m256 _p_8;
  __m256 _coeff1_avx;
  __m256 _coeff0_avx;
  int i_4;
  float coeff1;
  float coeff0;
  float *outptr_4;
  float *ptr1_2;
  float *ptr_4;
  int q_4;
  Mat *bottom_blob1_2;
  __m128 _p1_7;
  __m128 _p_7;
  __m256 _p1_6;
  __m256 _p_6;
  int i_3;
  float *outptr_3;
  float *ptr_3;
  int q_3;
  Mat *bottom_blob2_1;
  size_t b_1;
  __m128 _p1_5;
  __m128 _p_5;
  __m256 _p1_4;
  __m256 _p_4;
  int i_2;
  float *outptr_2;
  float *ptr1_1;
  float *ptr_2;
  int q_2;
  Mat *bottom_blob1_1;
  __m128 _p1_3;
  __m128 _p_3;
  __m256 _p1_2;
  __m256 _p_2;
  int i_1;
  float *outptr_1;
  float *ptr_1;
  int q_1;
  Mat *bottom_blob2;
  size_t b;
  __m128 _p1_1;
  __m128 _p_1;
  __m256 _p1;
  __m256 _p;
  int i;
  float *outptr;
  float *ptr1;
  float *ptr;
  int q;
  Mat *bottom_blob1;
  Mat *top_blob;
  int size;
  int elempack;
  int channels;
  int h;
  int w;
  Mat *bottom_blob;
  Mat *m_18;
  Mat *m_16;
  Mat *m_15;
  Mat *m_13;
  Mat *m_11;
  Mat *m_10;
  Mat *m_8;
  Mat *m_6;
  Mat *m_5;
  Mat *m_3;
  Mat *m_1;
  Mat *m;
  Mat *m_19;
  Mat *m_17;
  Mat *m_14;
  Mat *m_12;
  Mat *m_9;
  Mat *m_7;
  Mat *m_4;
  Mat *m_2;
  Allocator *in_stack_ffffffffffffd738;
  Mat *in_stack_ffffffffffffd740;
  Mat *in_stack_ffffffffffffd748;
  undefined8 local_2550;
  undefined8 uStack_2548;
  undefined8 local_2520;
  undefined8 uStack_2518;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  int local_24fc;
  undefined8 local_24f8;
  undefined8 local_24f0;
  undefined8 local_24e8;
  undefined4 local_24e0;
  Allocator *local_24d8;
  undefined4 local_24d0;
  undefined4 local_24cc;
  undefined4 local_24c8;
  undefined4 local_24c4;
  undefined4 local_24c0;
  undefined8 local_24b8;
  undefined1 (*local_24b0) [32];
  undefined8 local_24a8;
  undefined8 local_24a0;
  undefined8 local_2498;
  undefined4 local_2490;
  Allocator *local_2488;
  undefined4 local_2480;
  undefined4 local_247c;
  undefined4 local_2478;
  undefined4 local_2474;
  undefined4 local_2470;
  undefined8 local_2468;
  undefined1 (*local_2460) [32];
  int local_2454;
  const_reference local_2450;
  ulong local_2448;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined1 local_2430 [16];
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined1 local_2400 [32];
  int local_23d4;
  undefined8 local_23d0;
  undefined8 local_23c8;
  undefined8 local_23c0;
  undefined4 local_23b8;
  Allocator *local_23b0;
  undefined4 local_23a8;
  undefined4 local_23a4;
  undefined4 local_23a0;
  undefined4 local_239c;
  undefined4 local_2398;
  undefined8 local_2390;
  undefined1 (*local_2388) [32];
  undefined8 local_2380;
  undefined8 local_2378;
  undefined8 local_2370;
  undefined4 local_2368;
  Allocator *local_2360;
  undefined4 local_2358;
  undefined4 local_2354;
  undefined4 local_2350;
  undefined4 local_234c;
  undefined4 local_2348;
  undefined8 local_2340;
  undefined1 (*local_2338) [32];
  undefined8 local_2330;
  undefined8 local_2328;
  undefined8 local_2320;
  undefined4 local_2318;
  Allocator *local_2310;
  undefined4 local_2308;
  undefined4 local_2304;
  undefined4 local_2300;
  undefined4 local_22fc;
  undefined4 local_22f8;
  undefined8 local_22f0;
  undefined1 (*local_22e8) [32];
  int local_22dc;
  const_reference local_22d8;
  undefined8 local_22d0;
  undefined8 uStack_22c8;
  float local_22c0;
  float fStack_22bc;
  float fStack_22b8;
  float fStack_22b4;
  undefined1 local_22b0 [16];
  undefined8 local_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  undefined1 local_2280 [32];
  undefined8 local_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  int local_2240;
  float local_223c;
  undefined8 local_2238;
  undefined8 local_2230;
  undefined8 local_2228;
  undefined4 local_2220;
  Allocator *local_2218;
  undefined4 local_2210;
  undefined4 local_220c;
  undefined4 local_2208;
  undefined4 local_2204;
  undefined4 local_2200;
  undefined8 local_21f8;
  undefined1 (*local_21f0) [32];
  undefined8 local_21e8;
  undefined8 local_21e0;
  undefined8 local_21d8;
  undefined4 local_21d0;
  Allocator *local_21c8;
  undefined4 local_21c0;
  undefined4 local_21bc;
  undefined4 local_21b8;
  undefined4 local_21b4;
  undefined4 local_21b0;
  undefined8 local_21a8;
  undefined1 (*local_21a0) [32];
  int local_2194;
  const_reference local_2190;
  ulong local_2188;
  float local_2180;
  float fStack_217c;
  float fStack_2178;
  float fStack_2174;
  undefined8 local_2170;
  undefined8 uStack_2168;
  undefined1 local_2160 [16];
  undefined8 local_2150;
  undefined8 uStack_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined1 local_2120 [8];
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  int local_20ac;
  float local_20a8;
  float local_20a4;
  undefined8 local_20a0;
  undefined8 local_2098;
  undefined8 local_2090;
  undefined4 local_2088;
  Allocator *local_2080;
  undefined4 local_2078;
  undefined4 local_2074;
  undefined4 local_2070;
  undefined4 local_206c;
  undefined4 local_2068;
  undefined8 local_2060;
  undefined1 (*local_2058) [16];
  undefined8 local_2050;
  undefined8 local_2048;
  undefined8 local_2040;
  undefined4 local_2038;
  Allocator *local_2030;
  undefined4 local_2028;
  undefined4 local_2024;
  undefined4 local_2020;
  undefined4 local_201c;
  undefined4 local_2018;
  undefined8 local_2010;
  undefined1 (*local_2008) [32];
  undefined8 local_2000;
  undefined8 local_1ff8;
  undefined8 local_1ff0;
  undefined4 local_1fe8;
  Allocator *local_1fe0;
  undefined4 local_1fd8;
  undefined4 local_1fd4;
  undefined4 local_1fd0;
  undefined4 local_1fcc;
  undefined4 local_1fc8;
  undefined8 local_1fc0;
  undefined1 (*local_1fb8) [24];
  int local_1fac;
  const_reference local_1fa8;
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  float local_1f90;
  float fStack_1f8c;
  float fStack_1f88;
  float fStack_1f84;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  float local_1f60;
  float fStack_1f5c;
  float fStack_1f58;
  float fStack_1f54;
  float fStack_1f50;
  float fStack_1f4c;
  float fStack_1f48;
  float fStack_1f44;
  int local_1f3c;
  undefined8 local_1f38;
  undefined8 local_1f30;
  undefined8 local_1f28;
  undefined4 local_1f20;
  Allocator *local_1f18;
  undefined4 local_1f10;
  undefined4 local_1f0c;
  undefined4 local_1f08;
  undefined4 local_1f04;
  undefined4 local_1f00;
  undefined8 local_1ef8;
  undefined1 (*local_1ef0) [32];
  undefined8 local_1ee8;
  undefined8 local_1ee0;
  undefined8 local_1ed8;
  undefined4 local_1ed0;
  Allocator *local_1ec8;
  undefined4 local_1ec0;
  undefined4 local_1ebc;
  undefined4 local_1eb8;
  undefined4 local_1eb4;
  undefined4 local_1eb0;
  undefined8 local_1ea8;
  float *local_1ea0;
  int local_1e94;
  const_reference local_1e90;
  ulong local_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  float local_1e70;
  float fStack_1e6c;
  float fStack_1e68;
  float fStack_1e64;
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  float local_1e40;
  float fStack_1e3c;
  float fStack_1e38;
  float fStack_1e34;
  float fStack_1e30;
  float fStack_1e2c;
  float fStack_1e28;
  float fStack_1e24;
  int local_1e04;
  undefined8 local_1e00;
  undefined8 local_1df8;
  undefined8 local_1df0;
  undefined4 local_1de8;
  Allocator *local_1de0;
  undefined4 local_1dd8;
  undefined4 local_1dd4;
  undefined4 local_1dd0;
  undefined4 local_1dcc;
  undefined4 local_1dc8;
  undefined8 local_1dc0;
  undefined1 (*local_1db8) [32];
  undefined8 local_1db0;
  undefined8 local_1da8;
  undefined8 local_1da0;
  undefined4 local_1d98;
  Allocator *local_1d90;
  undefined4 local_1d88;
  undefined4 local_1d84;
  undefined4 local_1d80;
  undefined4 local_1d7c;
  undefined4 local_1d78;
  undefined8 local_1d70;
  float *local_1d68;
  undefined8 local_1d60;
  undefined8 local_1d58;
  undefined8 local_1d50;
  undefined4 local_1d48;
  Allocator *local_1d40;
  undefined4 local_1d38;
  undefined4 local_1d34;
  undefined4 local_1d30;
  undefined4 local_1d2c;
  undefined4 local_1d28;
  undefined8 local_1d20;
  undefined1 (*local_1d18) [12];
  int local_1d0c;
  const_reference local_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  float local_1cf0;
  float fStack_1cec;
  float fStack_1ce8;
  float fStack_1ce4;
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  float local_1cc0;
  float fStack_1cbc;
  float fStack_1cb8;
  float fStack_1cb4;
  float fStack_1cb0;
  float fStack_1cac;
  float fStack_1ca8;
  undefined4 uStack_1ca4;
  int local_1c9c;
  undefined8 local_1c98;
  undefined8 local_1c90;
  undefined8 local_1c88;
  undefined4 local_1c80;
  Allocator *local_1c78;
  undefined4 local_1c70;
  undefined4 local_1c6c;
  undefined4 local_1c68;
  undefined4 local_1c64;
  undefined4 local_1c60;
  undefined8 local_1c58;
  undefined1 (*local_1c50) [32];
  undefined8 local_1c48;
  undefined8 local_1c40;
  undefined8 local_1c38;
  undefined4 local_1c30;
  Allocator *local_1c28;
  undefined4 local_1c20;
  undefined4 local_1c1c;
  undefined4 local_1c18;
  undefined4 local_1c14;
  undefined4 local_1c10;
  undefined8 local_1c08;
  float *local_1c00;
  int local_1bf4;
  const_reference local_1bf0;
  ulong local_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  float local_1bd0;
  float fStack_1bcc;
  float fStack_1bc8;
  float fStack_1bc4;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  float local_1ba0;
  float fStack_1b9c;
  float fStack_1b98;
  float fStack_1b94;
  float fStack_1b90;
  float fStack_1b8c;
  float fStack_1b88;
  undefined4 uStack_1b84;
  int local_1b6c;
  undefined8 local_1b68;
  undefined8 local_1b60;
  undefined8 local_1b58;
  undefined4 local_1b50;
  Allocator *local_1b48;
  undefined4 local_1b40;
  undefined4 local_1b3c;
  undefined4 local_1b38;
  undefined4 local_1b34;
  undefined4 local_1b30;
  undefined8 local_1b28;
  undefined1 (*local_1b20) [32];
  undefined8 local_1b18;
  undefined8 local_1b10;
  undefined8 local_1b08;
  undefined4 local_1b00;
  Allocator *local_1af8;
  undefined4 local_1af0;
  undefined4 local_1aec;
  undefined4 local_1ae8;
  undefined4 local_1ae4;
  undefined4 local_1ae0;
  undefined8 local_1ad8;
  float *local_1ad0;
  undefined8 local_1ab8;
  undefined8 local_1ab0;
  undefined8 local_1aa8;
  undefined4 local_1aa0;
  Allocator *local_1a98;
  undefined4 local_1a90;
  undefined4 local_1a8c;
  undefined4 local_1a88;
  undefined4 local_1a84;
  undefined4 local_1a80;
  undefined8 local_1a78;
  undefined1 (*local_1a70) [12];
  int local_1a64;
  const_reference local_1a60;
  reference local_1a58;
  int local_1a4c;
  int local_1a48;
  int local_1a44;
  int local_1a40;
  int local_1a3c;
  const_reference local_1a38;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_1a28;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_1a20;
  int local_1a0c;
  reference local_1a08;
  undefined1 local_19fd;
  int local_19fc;
  const_reference local_19f8;
  undefined8 *local_19f0;
  undefined1 local_19e5;
  int local_19e4;
  const_reference local_19e0;
  undefined8 *local_19d8;
  undefined1 local_19cd;
  int local_19cc;
  const_reference local_19c8;
  undefined8 *local_19c0;
  undefined1 local_19b5;
  int local_19b4;
  const_reference local_19b0;
  undefined8 *local_19a8;
  undefined1 local_199d;
  int local_199c;
  const_reference local_1998;
  undefined8 *local_1990;
  undefined1 local_1985;
  int local_1984;
  const_reference local_1980;
  undefined8 *local_1978;
  undefined1 local_196d;
  int local_196c;
  const_reference local_1968;
  undefined8 *local_1960;
  undefined1 local_1955;
  int local_1954;
  const_reference local_1950;
  undefined8 *local_1948;
  undefined1 local_193d;
  int local_193c;
  const_reference local_1938;
  undefined8 *local_1930;
  undefined1 local_1925;
  int local_1924;
  const_reference local_1920;
  undefined8 *local_1918;
  undefined1 local_190d;
  int local_190c;
  const_reference local_1908;
  undefined8 *local_1900;
  undefined1 local_18f5;
  int local_18f4;
  const_reference local_18f0;
  undefined8 *local_18e8;
  undefined8 *local_18e0;
  undefined8 *local_18d8;
  undefined8 *local_18d0;
  undefined8 *local_18c8;
  undefined8 *local_18c0;
  undefined8 *local_18b8;
  undefined8 *local_18b0;
  undefined8 *local_18a8;
  undefined8 *local_18a0;
  undefined8 *local_1898;
  undefined8 *local_1890;
  undefined8 *local_1888;
  undefined8 *local_1820;
  undefined8 *local_1810;
  undefined8 *local_1800;
  undefined8 *local_17f0;
  undefined8 *local_17e0;
  undefined8 *local_17d0;
  undefined8 *local_17c0;
  undefined8 *local_17b0;
  undefined8 *local_17a0;
  undefined8 *local_1790;
  undefined8 *local_1780;
  undefined8 *local_1770;
  undefined8 *local_1760;
  undefined8 *local_1750;
  undefined8 *local_1740;
  undefined8 *local_1730;
  undefined8 *local_1720;
  undefined8 *local_1710;
  undefined8 *local_1700;
  undefined8 *local_16f0;
  undefined1 local_16dd;
  int local_16dc;
  reference local_16d8;
  undefined8 *local_16d0;
  undefined1 local_16bd;
  int local_16bc;
  reference local_16b8;
  undefined8 *local_16b0;
  undefined1 local_169d;
  int local_169c;
  reference local_1698;
  undefined8 *local_1690;
  undefined1 local_167d;
  int local_167c;
  reference local_1678;
  undefined8 *local_1670;
  undefined1 local_165d;
  int local_165c;
  reference local_1658;
  undefined8 *local_1650;
  undefined1 local_163d;
  int local_163c;
  reference local_1638;
  undefined8 *local_1630;
  undefined1 local_161d;
  int local_161c;
  reference local_1618;
  undefined8 *local_1610;
  undefined1 local_15fd;
  int local_15fc;
  reference local_15f8;
  undefined8 *local_15f0;
  undefined8 *local_15e0;
  undefined8 *local_15d8;
  undefined8 *local_15d0;
  undefined8 *local_15c8;
  undefined8 *local_15c0;
  undefined8 *local_15b8;
  undefined8 *local_15b0;
  undefined8 *local_15a8;
  undefined1 (*local_15a0) [32];
  undefined1 (*local_1598) [32];
  undefined1 (*local_1590) [32];
  undefined1 (*local_1588) [32];
  undefined1 (*local_1580) [32];
  undefined1 (*local_1578) [32];
  undefined1 (*local_1570) [32];
  undefined1 (*local_1568) [24];
  float *local_1560;
  undefined1 (*local_1558) [32];
  float *local_1550;
  undefined1 (*local_1548) [12];
  float *local_1540;
  undefined1 (*local_1538) [32];
  float *local_1530;
  undefined1 (*local_1528) [12];
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined1 local_14c0 [8];
  float fStack_14b8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined1 local_1480 [8];
  float fStack_1478;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined1 (*local_1428) [32];
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined1 (*local_13e8) [32];
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined1 (*local_13a8) [32];
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined1 (*local_1368) [16];
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined1 (*local_1328) [32];
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined1 (*local_12e8) [32];
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined1 (*local_12a8) [32];
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined1 (*local_1268) [32];
  undefined1 (*local_1260) [32];
  undefined1 (*local_1258) [32];
  undefined1 (*local_1250) [32];
  undefined1 (*local_1248) [32];
  undefined1 (*local_1240) [32];
  undefined1 (*local_1238) [32];
  undefined1 (*local_1230) [32];
  undefined1 (*local_1228) [24];
  float *local_1220;
  undefined1 (*local_1218) [32];
  float *local_1210;
  undefined1 (*local_1208) [12];
  float *local_1200;
  undefined1 (*local_11f8) [32];
  float *local_11f0;
  undefined1 (*local_11e8) [12];
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 local_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 local_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 local_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined1 local_1170 [8];
  float fStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined1 local_1150 [8];
  float fStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined1 (*local_1128) [32];
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined1 (*local_1108) [32];
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined1 (*local_10e8) [32];
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined1 (*local_10c8) [16];
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined1 (*local_10a8) [32];
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined1 (*local_1088) [32];
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined1 (*local_1068) [32];
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined1 (*local_1048) [32];
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined1 local_1020 [8];
  float fStack_1018;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined1 local_fe0 [8];
  float fStack_fd8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined1 local_fb0 [16];
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined1 local_f90 [16];
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined1 local_f70 [8];
  float fStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined1 local_f50 [8];
  float fStack_f48;
  size_type local_f40;
  long *local_f38;
  undefined8 local_f30;
  long *local_f28;
  undefined8 local_f20;
  undefined8 *local_f18;
  float local_f0c;
  float local_f08;
  float local_f04;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  float local_e40;
  float fStack_e3c;
  float fStack_e38;
  float fStack_e34;
  float local_e24;
  float local_e20;
  float fStack_e1c;
  float fStack_e18;
  float fStack_e14;
  float local_e04;
  float local_e00;
  float fStack_dfc;
  float fStack_df8;
  float fStack_df4;
  float local_de4;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 local_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  reference local_d08;
  Allocator *local_d00;
  int local_cf4;
  size_t local_cf0;
  undefined1 (*local_ce8) [32];
  int local_cdc;
  int local_cd8;
  int local_cd4;
  undefined8 *local_cd0;
  Allocator *local_cc8;
  int local_cbc;
  size_t local_cb8;
  undefined1 (*local_cb0) [32];
  int local_ca4;
  int local_ca0;
  int local_c9c;
  undefined8 *local_c98;
  Allocator *local_c90;
  int local_c84;
  size_t local_c80;
  undefined1 (*local_c78) [32];
  int local_c6c;
  int local_c68;
  int local_c64;
  undefined8 *local_c60;
  Allocator *local_c58;
  int local_c4c;
  size_t local_c48;
  undefined1 (*local_c40) [32];
  int local_c34;
  int local_c30;
  int local_c2c;
  undefined8 *local_c28;
  Allocator *local_c20;
  int local_c14;
  size_t local_c10;
  undefined1 (*local_c08) [16];
  int local_bfc;
  int local_bf8;
  int local_bf4;
  undefined8 *local_bf0;
  Allocator *local_be8;
  int local_bdc;
  size_t local_bd8;
  undefined1 (*local_bd0) [32];
  int local_bc4;
  int local_bc0;
  int local_bbc;
  undefined8 *local_bb8;
  Allocator *local_bb0;
  int local_ba4;
  size_t local_ba0;
  undefined1 (*local_b98) [32];
  int local_b8c;
  int local_b88;
  int local_b84;
  undefined8 *local_b80;
  Allocator *local_b78;
  int local_b6c;
  size_t local_b68;
  undefined1 (*local_b60) [32];
  int local_b54;
  int local_b50;
  int local_b4c;
  undefined8 *local_b48;
  Allocator *local_b40;
  int local_b34;
  size_t local_b30;
  undefined1 (*local_b28) [12];
  int local_b1c;
  int local_b18;
  int local_b14;
  undefined8 *local_b10;
  Allocator *local_b08;
  int local_afc;
  size_t local_af8;
  float *local_af0;
  int local_ae4;
  int local_ae0;
  int local_adc;
  undefined8 *local_ad8;
  Allocator *local_ad0;
  int local_ac4;
  size_t local_ac0;
  float *local_ab8;
  int local_aac;
  int local_aa8;
  int local_aa4;
  undefined8 *local_aa0;
  Allocator *local_a98;
  int local_a8c;
  size_t local_a88;
  undefined1 (*local_a80) [12];
  int local_a74;
  int local_a70;
  int local_a6c;
  undefined8 *local_a68;
  Allocator *local_a60;
  int local_a54;
  size_t local_a50;
  float *local_a48;
  int local_a3c;
  int local_a38;
  int local_a34;
  undefined8 *local_a30;
  Allocator *local_a28;
  int local_a1c;
  size_t local_a18;
  float *local_a10;
  int local_a04;
  int local_a00;
  int local_9fc;
  undefined8 *local_9f8;
  Allocator *local_9f0;
  int local_9e4;
  size_t local_9e0;
  undefined1 (*local_9d8) [24];
  int local_9cc;
  int local_9c8;
  int local_9c4;
  undefined8 *local_9c0;
  Allocator *local_9b8;
  int local_9ac;
  size_t local_9a8;
  undefined1 (*local_9a0) [32];
  int local_994;
  int local_990;
  int local_98c;
  undefined8 *local_988;
  Allocator *local_980;
  int local_974;
  size_t local_970;
  undefined1 (*local_968) [32];
  int local_95c;
  int local_958;
  int local_954;
  undefined8 *local_950;
  Allocator *local_948;
  int local_93c;
  size_t local_938;
  undefined1 (*local_930) [32];
  int local_924;
  int local_920;
  int local_91c;
  undefined8 *local_918;
  Allocator *local_910;
  int local_904;
  size_t local_900;
  undefined1 (*local_8f8) [32];
  int local_8ec;
  int local_8e8;
  int local_8e4;
  undefined8 *local_8e0;
  Allocator *local_8d8;
  int local_8cc;
  size_t local_8c8;
  undefined1 (*local_8c0) [32];
  int local_8b4;
  int local_8b0;
  int local_8ac;
  undefined8 *local_8a8;
  undefined4 local_89c;
  long local_898;
  undefined4 local_88c;
  long local_888;
  undefined4 local_87c;
  long local_878;
  undefined4 local_86c;
  long local_868;
  undefined4 local_85c;
  long local_858;
  undefined4 local_84c;
  long local_848;
  undefined4 local_83c;
  long local_838;
  undefined4 local_82c;
  long local_828;
  undefined4 local_81c;
  long local_818;
  undefined4 local_80c;
  long local_808;
  undefined4 local_7fc;
  long local_7f8;
  undefined4 local_7ec;
  long local_7e8;
  undefined4 local_7dc;
  long local_7d8;
  undefined4 local_7cc;
  long local_7c8;
  undefined4 local_7bc;
  long local_7b8;
  undefined4 local_7ac;
  long local_7a8;
  undefined4 local_79c;
  long local_798;
  undefined4 local_78c;
  long local_788;
  undefined4 local_77c;
  long local_778;
  undefined4 local_76c;
  long local_768;
  undefined8 *local_6c8;
  undefined8 *local_6a8;
  undefined8 *local_688;
  undefined8 *local_668;
  undefined8 *local_648;
  undefined8 *local_628;
  undefined8 *local_608;
  undefined8 *local_5e8;
  undefined8 *local_5c8;
  undefined8 *local_5a8;
  undefined8 *local_588;
  undefined8 *local_568;
  undefined8 *local_548;
  undefined8 *local_528;
  undefined8 *local_508;
  undefined8 *local_4e8;
  undefined8 *local_4c8;
  undefined8 *local_4a8;
  undefined8 *local_488;
  undefined8 *local_468;
  undefined1 local_1c0 [16];
  undefined1 auStack_1b0 [16];
  float local_1a0;
  float local_19c;
  float local_198;
  float local_194;
  float local_190;
  float local_18c;
  float local_188;
  float local_184;
  undefined1 local_180 [32];
  float local_160;
  float local_15c;
  float local_158;
  float local_154;
  float local_150;
  float local_14c;
  float local_148;
  float local_144;
  undefined1 local_140 [32];
  float local_120;
  float local_11c;
  float local_118;
  float local_114;
  float local_110;
  float local_10c;
  float local_108;
  float local_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  
  local_1a28 = in_RDX;
  local_1a20 = in_RSI;
  local_1a38 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_1a3c = local_1a38->w;
  local_1a40 = local_1a38->h;
  local_1a44 = local_1a38->c;
  local_1a48 = local_1a38->elempack;
  local_1a4c = local_1a3c * local_1a40 * local_1a48;
  local_1a58 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1a28,0);
  Mat::create_like(in_stack_ffffffffffffd748,in_stack_ffffffffffffd740,in_stack_ffffffffffffd738);
  local_1a08 = local_1a58;
  bVar31 = true;
  if (local_1a58->data != (void *)0x0) {
    local_d08 = local_1a58;
    bVar31 = local_1a58->cstep * (long)local_1a58->c == 0;
  }
  if (bVar31) {
    local_1a0c = -100;
  }
  else {
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0) {
      local_1a60 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1a20,1);
      for (local_1a64 = 0; local_1a64 < local_1a44; local_1a64 = local_1a64 + 1) {
        local_18e8 = &local_1ab8;
        local_b14 = local_1a38->w;
        local_b18 = local_1a38->h;
        local_b1c = local_1a38->d;
        local_b28 = (undefined1 (*) [12])
                    ((long)local_1a38->data +
                    local_1a38->cstep * (long)local_1a64 * local_1a38->elemsize);
        local_b30 = local_1a38->elemsize;
        local_b34 = local_1a38->elempack;
        local_b40 = local_1a38->allocator;
        local_b10 = &local_1ab8;
        local_7e8 = (long)local_b14 * (long)local_b18 * local_b30;
        local_1888 = &local_1ab8;
        local_1820 = &local_1ab8;
        local_1900 = &local_1b18;
        local_adc = local_1a60->w;
        local_ae0 = local_1a60->h;
        local_ae4 = local_1a60->d;
        local_af0 = (float *)((long)local_1a60->data +
                             local_1a60->cstep * (long)local_1a64 * local_1a60->elemsize);
        local_af8 = local_1a60->elemsize;
        local_afc = local_1a60->elempack;
        local_b08 = local_1a60->allocator;
        local_ad8 = &local_1b18;
        local_7f8 = (long)local_adc * (long)local_ae0 * local_af8;
        local_1890 = &local_1b18;
        local_1810 = &local_1b18;
        local_1a80 = 0;
        local_1a84 = 0;
        local_1a88 = 0;
        local_1a8c = 0;
        local_1aa0 = 0;
        local_1aa8 = 0;
        local_1ab0 = 0;
        local_1ab8 = 0;
        local_7ec = 0x10;
        local_7fc = 0x10;
        local_18f0 = local_1a38;
        local_18f4 = local_1a64;
        local_18f5 = 1;
        local_190c = local_1a64;
        local_190d = 1;
        local_1a78 = 0;
        local_1a90 = 0;
        local_1b18 = 0;
        local_1b08 = 0;
        local_1b00 = 0;
        local_1aec = 0;
        local_1ae8 = 0;
        local_1ae4 = 0;
        local_1ae0 = 0;
        local_1b10 = 0;
        local_15f0 = &local_1b68;
        local_cd4 = local_1a58->w;
        local_cd8 = local_1a58->h;
        local_cdc = local_1a58->d;
        local_ce8 = (undefined1 (*) [32])
                    ((long)local_1a58->data +
                    local_1a58->cstep * (long)local_1a64 * local_1a58->elemsize);
        local_cf0 = local_1a58->elemsize;
        local_cf4 = local_1a58->elempack;
        local_d00 = local_1a58->allocator;
        local_cd0 = &local_1b68;
        local_768 = (long)local_cd4 * (long)local_cd8 * local_cf0;
        local_76c = 0x10;
        local_15f8 = local_1a58;
        local_15fc = local_1a64;
        local_15fd = 1;
        local_1ad8 = 0;
        local_1af0 = 0;
        local_15a8 = &local_1b68;
        local_1800 = &local_1b68;
        local_1b68 = 0;
        local_1b58 = 0;
        local_1b50 = 0;
        local_1b40 = 0;
        local_1b3c = 0;
        local_1b38 = 0;
        local_1b34 = 0;
        local_1b30 = 0;
        local_1b28 = 0;
        local_1b60 = 0;
        local_1b20 = local_ce8;
        local_1ad0 = local_af0;
        local_1a70 = local_b28;
        for (local_1b6c = 0; local_1b6c + 7 < local_1a4c; local_1b6c = local_1b6c + 8) {
          local_1528 = local_1a70;
          auVar26 = *local_1a70;
          fStack_1b94 = (float)((ulong)*(undefined8 *)(*local_1a70 + 8) >> 0x20);
          fStack_1b90 = (float)*(undefined8 *)(local_1a70[1] + 4);
          fStack_1b8c = (float)((ulong)*(undefined8 *)(local_1a70[1] + 4) >> 0x20);
          fStack_1b88 = (float)*(undefined8 *)local_1a70[2];
          uStack_1b84 = (undefined4)((ulong)*(undefined8 *)local_1a70[2] >> 0x20);
          local_1530 = local_1ad0;
          local_1bc0 = *(undefined8 *)local_1ad0;
          uStack_1bb8 = *(undefined8 *)(local_1ad0 + 2);
          uStack_1bb0 = *(undefined8 *)(local_1ad0 + 4);
          uStack_1ba8 = *(undefined8 *)(local_1ad0 + 6);
          auVar3._12_4_ = fStack_1b94;
          auVar3._0_12_ = auVar26;
          auVar3._16_4_ = fStack_1b90;
          auVar3._20_4_ = fStack_1b8c;
          auVar3._24_4_ = fStack_1b88;
          auVar3._28_4_ = uStack_1b84;
          local_1480._0_4_ = auVar26._0_4_;
          local_1480._4_4_ = auVar26._4_4_;
          fStack_1478 = auVar26._8_4_;
          local_14a0._0_4_ = (float)local_1bc0;
          local_14a0._4_4_ = (float)((ulong)local_1bc0 >> 0x20);
          uStack_1498._0_4_ = (float)uStack_1bb8;
          uStack_1498._4_4_ = (float)((ulong)uStack_1bb8 >> 0x20);
          uStack_1490._0_4_ = (float)uStack_1bb0;
          uStack_1490._4_4_ = (float)((ulong)uStack_1bb0 >> 0x20);
          uStack_1488._0_4_ = (float)uStack_1ba8;
          local_1ba0 = (float)local_1480._0_4_ * (float)local_14a0;
          fStack_1b9c = (float)local_1480._4_4_ * local_14a0._4_4_;
          fStack_1b98 = fStack_1478 * (float)uStack_1498;
          fStack_1b94 = fStack_1b94 * uStack_1498._4_4_;
          fStack_1b90 = fStack_1b90 * (float)uStack_1490;
          fStack_1b8c = fStack_1b8c * uStack_1490._4_4_;
          fStack_1b88 = fStack_1b88 * (float)uStack_1488;
          local_1268 = local_1b20;
          local_12a0 = CONCAT44(fStack_1b9c,local_1ba0);
          uStack_1298 = CONCAT44(fStack_1b94,fStack_1b98);
          uStack_1290 = CONCAT44(fStack_1b8c,fStack_1b90);
          uStack_1288 = CONCAT44(uStack_1b84,fStack_1b88);
          auVar17._8_8_ = uStack_1298;
          auVar17._0_8_ = local_12a0;
          auVar17._16_8_ = uStack_1290;
          auVar17._24_8_ = uStack_1288;
          *local_1b20 = auVar17;
          local_1a70 = (undefined1 (*) [12])(local_1a70[2] + 8);
          local_1ad0 = local_1ad0 + 8;
          local_1b20 = local_1b20 + 1;
          local_14a0 = local_1bc0;
          uStack_1498 = uStack_1bb8;
          uStack_1490 = uStack_1bb0;
          uStack_1488 = uStack_1ba8;
          _local_1480 = auVar3;
        }
        for (; local_1b6c + 3 < local_1a4c; local_1b6c = local_1b6c + 4) {
          local_11e8 = local_1a70;
          auVar26 = *local_1a70;
          fStack_1bc4 = (float)((ulong)*(undefined8 *)(*local_1a70 + 8) >> 0x20);
          local_11f0 = local_1ad0;
          local_1be0 = *(undefined8 *)local_1ad0;
          uStack_1bd8 = *(undefined8 *)(local_1ad0 + 2);
          auVar2._12_4_ = fStack_1bc4;
          auVar2._0_12_ = auVar26;
          local_1150._0_4_ = auVar26._0_4_;
          local_1150._4_4_ = auVar26._4_4_;
          fStack_1148 = auVar26._8_4_;
          local_1160._0_4_ = (float)local_1be0;
          local_1160._4_4_ = (float)((ulong)local_1be0 >> 0x20);
          uStack_1158._0_4_ = (float)uStack_1bd8;
          uStack_1158._4_4_ = (float)((ulong)uStack_1bd8 >> 0x20);
          local_1bd0 = (float)local_1150._0_4_ * (float)local_1160;
          fStack_1bcc = (float)local_1150._4_4_ * local_1160._4_4_;
          fStack_1bc8 = fStack_1148 * (float)uStack_1158;
          fStack_1bc4 = fStack_1bc4 * uStack_1158._4_4_;
          local_1048 = local_1b20;
          local_1060 = CONCAT44(fStack_1bcc,local_1bd0);
          uStack_1058 = CONCAT44(fStack_1bc4,fStack_1bc8);
          auVar1._8_8_ = uStack_1058;
          auVar1._0_8_ = local_1060;
          *(undefined1 (*) [16])*local_1b20 = auVar1;
          local_1a70 = (undefined1 (*) [12])(local_1a70[1] + 4);
          local_1ad0 = local_1ad0 + 4;
          local_1b20 = (undefined1 (*) [32])(*local_1b20 + 0x10);
          local_1160 = local_1be0;
          uStack_1158 = uStack_1bd8;
          _local_1150 = auVar2;
        }
        for (; local_1b6c < local_1a4c; local_1b6c = local_1b6c + 1) {
          *(float *)*local_1b20 = *(float *)*local_1a70 * *local_1ad0;
          local_1a70 = (undefined1 (*) [12])(*local_1a70 + 4);
          local_1ad0 = local_1ad0 + 1;
          local_1b20 = (undefined1 (*) [32])(*local_1b20 + 4);
        }
        local_1908 = local_1a60;
        local_4a8 = local_1800;
        local_488 = local_1810;
        local_468 = local_1820;
        local_1b48 = local_d00;
        local_1af8 = local_b08;
        local_1a98 = local_b40;
      }
      for (local_1be8 = 2; uVar28 = local_1be8,
          sVar29 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_1a20),
          uVar28 < sVar29; local_1be8 = local_1be8 + 1) {
        local_1bf0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                               (local_1a20,local_1be8);
        for (local_1bf4 = 0; local_1bf4 < local_1a44; local_1bf4 = local_1bf4 + 1) {
          local_1918 = &local_1c48;
          local_aa4 = local_1bf0->w;
          local_aa8 = local_1bf0->h;
          local_aac = local_1bf0->d;
          local_ab8 = (float *)((long)local_1bf0->data +
                               local_1bf0->cstep * (long)local_1bf4 * local_1bf0->elemsize);
          local_ac0 = local_1bf0->elemsize;
          local_ac4 = local_1bf0->elempack;
          local_ad0 = local_1bf0->allocator;
          local_aa0 = &local_1c48;
          local_808 = (long)local_aa4 * (long)local_aa8 * local_ac0;
          local_1898 = &local_1c48;
          local_17f0 = &local_1c48;
          local_80c = 0x10;
          local_1924 = local_1bf4;
          local_1925 = 1;
          local_1c48 = 0;
          local_1c38 = 0;
          local_1c30 = 0;
          local_1c1c = 0;
          local_1c18 = 0;
          local_1c14 = 0;
          local_1c10 = 0;
          local_1c40 = 0;
          local_1610 = &local_1c98;
          local_c9c = local_1a58->w;
          local_ca0 = local_1a58->h;
          local_ca4 = local_1a58->d;
          local_cb0 = (undefined1 (*) [32])
                      ((long)local_1a58->data +
                      local_1a58->cstep * (long)local_1bf4 * local_1a58->elemsize);
          local_cb8 = local_1a58->elemsize;
          local_cbc = local_1a58->elempack;
          local_cc8 = local_1a58->allocator;
          local_c98 = &local_1c98;
          local_778 = (long)local_c9c * (long)local_ca0 * local_cb8;
          local_77c = 0x10;
          local_1618 = local_1a58;
          local_161c = local_1bf4;
          local_161d = 1;
          local_1c08 = 0;
          local_1c20 = 0;
          local_15b0 = &local_1c98;
          local_17e0 = &local_1c98;
          local_1c98 = 0;
          local_1c88 = 0;
          local_1c80 = 0;
          local_1c70 = 0;
          local_1c6c = 0;
          local_1c68 = 0;
          local_1c64 = 0;
          local_1c60 = 0;
          local_1c58 = 0;
          local_1c90 = 0;
          local_1c50 = local_cb0;
          local_1c00 = local_ab8;
          for (local_1c9c = 0; local_1c9c + 7 < local_1a4c; local_1c9c = local_1c9c + 8) {
            local_1538 = local_1c50;
            auVar26 = *(undefined1 (*) [12])*local_1c50;
            fStack_1cb4 = (float)((ulong)*(undefined8 *)(*local_1c50 + 8) >> 0x20);
            fStack_1cb0 = (float)*(undefined8 *)(*local_1c50 + 0x10);
            fStack_1cac = (float)((ulong)*(undefined8 *)(*local_1c50 + 0x10) >> 0x20);
            fStack_1ca8 = (float)*(undefined8 *)(*local_1c50 + 0x18);
            uStack_1ca4 = (undefined4)((ulong)*(undefined8 *)(*local_1c50 + 0x18) >> 0x20);
            local_1540 = local_1c00;
            local_1ce0 = *(undefined8 *)local_1c00;
            uStack_1cd8 = *(undefined8 *)(local_1c00 + 2);
            uStack_1cd0 = *(undefined8 *)(local_1c00 + 4);
            uStack_1cc8 = *(undefined8 *)(local_1c00 + 6);
            auVar13._12_4_ = fStack_1cb4;
            auVar13._0_12_ = auVar26;
            auVar13._16_4_ = fStack_1cb0;
            auVar13._20_4_ = fStack_1cac;
            auVar13._24_4_ = fStack_1ca8;
            auVar13._28_4_ = uStack_1ca4;
            local_14c0._0_4_ = auVar26._0_4_;
            local_14c0._4_4_ = auVar26._4_4_;
            fStack_14b8 = auVar26._8_4_;
            local_14e0._0_4_ = (float)local_1ce0;
            local_14e0._4_4_ = (float)((ulong)local_1ce0 >> 0x20);
            uStack_14d8._0_4_ = (float)uStack_1cd8;
            uStack_14d8._4_4_ = (float)((ulong)uStack_1cd8 >> 0x20);
            uStack_14d0._0_4_ = (float)uStack_1cd0;
            uStack_14d0._4_4_ = (float)((ulong)uStack_1cd0 >> 0x20);
            uStack_14c8._0_4_ = (float)uStack_1cc8;
            local_1cc0 = (float)local_14c0._0_4_ * (float)local_14e0;
            fStack_1cbc = (float)local_14c0._4_4_ * local_14e0._4_4_;
            fStack_1cb8 = fStack_14b8 * (float)uStack_14d8;
            fStack_1cb4 = fStack_1cb4 * uStack_14d8._4_4_;
            fStack_1cb0 = fStack_1cb0 * (float)uStack_14d0;
            fStack_1cac = fStack_1cac * uStack_14d0._4_4_;
            fStack_1ca8 = fStack_1ca8 * (float)uStack_14c8;
            local_12a8 = local_1c50;
            local_12e0 = CONCAT44(fStack_1cbc,local_1cc0);
            uStack_12d8 = CONCAT44(fStack_1cb4,fStack_1cb8);
            uStack_12d0 = CONCAT44(fStack_1cac,fStack_1cb0);
            uStack_12c8 = CONCAT44(uStack_1ca4,fStack_1ca8);
            auVar16._8_8_ = uStack_12d8;
            auVar16._0_8_ = local_12e0;
            auVar16._16_8_ = uStack_12d0;
            auVar16._24_8_ = uStack_12c8;
            *local_1c50 = auVar16;
            local_1c00 = local_1c00 + 8;
            local_1c50 = local_1c50 + 1;
            local_14e0 = local_1ce0;
            uStack_14d8 = uStack_1cd8;
            uStack_14d0 = uStack_1cd0;
            uStack_14c8 = uStack_1cc8;
            _local_14c0 = auVar13;
          }
          for (; local_1c9c + 3 < local_1a4c; local_1c9c = local_1c9c + 4) {
            local_11f8 = local_1c50;
            auVar26 = *(undefined1 (*) [12])*local_1c50;
            fStack_1ce4 = (float)((ulong)*(undefined8 *)(*local_1c50 + 8) >> 0x20);
            local_1200 = local_1c00;
            local_1d00 = *(undefined8 *)local_1c00;
            uStack_1cf8 = *(undefined8 *)(local_1c00 + 2);
            auVar12._12_4_ = fStack_1ce4;
            auVar12._0_12_ = auVar26;
            local_1170._0_4_ = auVar26._0_4_;
            local_1170._4_4_ = auVar26._4_4_;
            fStack_1168 = auVar26._8_4_;
            local_1180._0_4_ = (float)local_1d00;
            local_1180._4_4_ = (float)((ulong)local_1d00 >> 0x20);
            uStack_1178._0_4_ = (float)uStack_1cf8;
            uStack_1178._4_4_ = (float)((ulong)uStack_1cf8 >> 0x20);
            local_1cf0 = (float)local_1170._0_4_ * (float)local_1180;
            fStack_1cec = (float)local_1170._4_4_ * local_1180._4_4_;
            fStack_1ce8 = fStack_1168 * (float)uStack_1178;
            fStack_1ce4 = fStack_1ce4 * uStack_1178._4_4_;
            local_1068 = local_1c50;
            local_1080 = CONCAT44(fStack_1cec,local_1cf0);
            uStack_1078 = CONCAT44(fStack_1ce4,fStack_1ce8);
            auVar22._8_8_ = uStack_1078;
            auVar22._0_8_ = local_1080;
            *(undefined1 (*) [16])*local_1c50 = auVar22;
            local_1c00 = local_1c00 + 4;
            local_1c50 = (undefined1 (*) [32])(*local_1c50 + 0x10);
            local_1180 = local_1d00;
            uStack_1178 = uStack_1cf8;
            _local_1170 = auVar12;
          }
          for (; local_1c9c < local_1a4c; local_1c9c = local_1c9c + 1) {
            *(float *)*local_1c50 = *local_1c00 * *(float *)*local_1c50;
            local_1c00 = local_1c00 + 1;
            local_1c50 = (undefined1 (*) [32])(*local_1c50 + 4);
          }
          local_1920 = local_1bf0;
          local_4e8 = local_17e0;
          local_4c8 = local_17f0;
          local_1c78 = local_cc8;
          local_1c28 = local_ad0;
        }
      }
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x104) == 0) {
        local_1d08 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1a20,1);
        for (local_1d0c = 0; local_1d0c < local_1a44; local_1d0c = local_1d0c + 1) {
          local_1930 = &local_1d60;
          local_a6c = local_1a38->w;
          local_a70 = local_1a38->h;
          local_a74 = local_1a38->d;
          local_a80 = (undefined1 (*) [12])
                      ((long)local_1a38->data +
                      local_1a38->cstep * (long)local_1d0c * local_1a38->elemsize);
          local_a88 = local_1a38->elemsize;
          local_a8c = local_1a38->elempack;
          local_a98 = local_1a38->allocator;
          local_a68 = &local_1d60;
          local_818 = (long)local_a6c * (long)local_a70 * local_a88;
          local_18a0 = &local_1d60;
          local_17d0 = &local_1d60;
          local_1948 = &local_1db0;
          local_a34 = local_1d08->w;
          local_a38 = local_1d08->h;
          local_a3c = local_1d08->d;
          local_a48 = (float *)((long)local_1d08->data +
                               local_1d08->cstep * (long)local_1d0c * local_1d08->elemsize);
          local_a50 = local_1d08->elemsize;
          local_a54 = local_1d08->elempack;
          local_a60 = local_1d08->allocator;
          local_a30 = &local_1db0;
          local_828 = (long)local_a34 * (long)local_a38 * local_a50;
          local_18a8 = &local_1db0;
          local_17c0 = &local_1db0;
          local_1d28 = 0;
          local_1d2c = 0;
          local_1d30 = 0;
          local_1d34 = 0;
          local_1d48 = 0;
          local_1d50 = 0;
          local_1d58 = 0;
          local_1d60 = 0;
          local_81c = 0x10;
          local_82c = 0x10;
          local_1938 = local_1a38;
          local_193c = local_1d0c;
          local_193d = 1;
          local_1954 = local_1d0c;
          local_1955 = 1;
          local_1d20 = 0;
          local_1d38 = 0;
          local_1db0 = 0;
          local_1da0 = 0;
          local_1d98 = 0;
          local_1d84 = 0;
          local_1d80 = 0;
          local_1d7c = 0;
          local_1d78 = 0;
          local_1da8 = 0;
          local_1630 = &local_1e00;
          local_c64 = local_1a58->w;
          local_c68 = local_1a58->h;
          local_c6c = local_1a58->d;
          local_c78 = (undefined1 (*) [32])
                      ((long)local_1a58->data +
                      local_1a58->cstep * (long)local_1d0c * local_1a58->elemsize);
          local_c80 = local_1a58->elemsize;
          local_c84 = local_1a58->elempack;
          local_c90 = local_1a58->allocator;
          local_c60 = &local_1e00;
          local_788 = (long)local_c64 * (long)local_c68 * local_c80;
          local_78c = 0x10;
          local_1638 = local_1a58;
          local_163c = local_1d0c;
          local_163d = 1;
          local_1d70 = 0;
          local_1d88 = 0;
          local_15b8 = &local_1e00;
          local_17b0 = &local_1e00;
          local_1e00 = 0;
          local_1df0 = 0;
          local_1de8 = 0;
          local_1dd8 = 0;
          local_1dd4 = 0;
          local_1dd0 = 0;
          local_1dcc = 0;
          local_1dc8 = 0;
          local_1dc0 = 0;
          local_1df8 = 0;
          local_1db8 = local_c78;
          local_1d68 = local_a48;
          local_1d18 = local_a80;
          for (local_1e04 = 0; local_1e04 + 7 < local_1a4c; local_1e04 = local_1e04 + 8) {
            local_1548 = local_1d18;
            auVar26 = *local_1d18;
            fStack_1e34 = (float)((ulong)*(undefined8 *)(*local_1d18 + 8) >> 0x20);
            fStack_1e30 = (float)*(undefined8 *)(local_1d18[1] + 4);
            fStack_1e2c = (float)((ulong)*(undefined8 *)(local_1d18[1] + 4) >> 0x20);
            fStack_1e28 = (float)*(undefined8 *)local_1d18[2];
            fStack_1e24 = (float)((ulong)*(undefined8 *)local_1d18[2] >> 0x20);
            local_1550 = local_1d68;
            local_1e60 = *(undefined8 *)local_1d68;
            uStack_1e58 = *(undefined8 *)(local_1d68 + 2);
            uStack_1e50 = *(undefined8 *)(local_1d68 + 4);
            uStack_1e48 = *(undefined8 *)(local_1d68 + 6);
            auVar11._12_4_ = fStack_1e34;
            auVar11._0_12_ = auVar26;
            auVar11._16_4_ = fStack_1e30;
            auVar11._20_4_ = fStack_1e2c;
            auVar11._24_4_ = fStack_1e28;
            auVar11._28_4_ = fStack_1e24;
            local_fe0._0_4_ = auVar26._0_4_;
            local_fe0._4_4_ = auVar26._4_4_;
            fStack_fd8 = auVar26._8_4_;
            local_1000._0_4_ = (float)local_1e60;
            local_1000._4_4_ = (float)((ulong)local_1e60 >> 0x20);
            uStack_ff8._0_4_ = (float)uStack_1e58;
            uStack_ff8._4_4_ = (float)((ulong)uStack_1e58 >> 0x20);
            uStack_ff0._0_4_ = (float)uStack_1e50;
            uStack_ff0._4_4_ = (float)((ulong)uStack_1e50 >> 0x20);
            uStack_fe8._0_4_ = (float)uStack_1e48;
            uStack_fe8._4_4_ = (float)((ulong)uStack_1e48 >> 0x20);
            local_1e40 = (float)local_fe0._0_4_ + (float)local_1000;
            fStack_1e3c = (float)local_fe0._4_4_ + local_1000._4_4_;
            fStack_1e38 = fStack_fd8 + (float)uStack_ff8;
            fStack_1e34 = fStack_1e34 + uStack_ff8._4_4_;
            fStack_1e30 = fStack_1e30 + (float)uStack_ff0;
            fStack_1e2c = fStack_1e2c + uStack_ff0._4_4_;
            fStack_1e28 = fStack_1e28 + (float)uStack_fe8;
            fStack_1e24 = fStack_1e24 + uStack_fe8._4_4_;
            local_12e8 = local_1db8;
            local_1320 = CONCAT44(fStack_1e3c,local_1e40);
            uStack_1318 = CONCAT44(fStack_1e34,fStack_1e38);
            uStack_1310 = CONCAT44(fStack_1e2c,fStack_1e30);
            uStack_1308 = CONCAT44(fStack_1e24,fStack_1e28);
            auVar15._8_8_ = uStack_1318;
            auVar15._0_8_ = local_1320;
            auVar15._16_8_ = uStack_1310;
            auVar15._24_8_ = uStack_1308;
            *local_1db8 = auVar15;
            local_1d18 = (undefined1 (*) [12])(local_1d18[2] + 8);
            local_1d68 = local_1d68 + 8;
            local_1db8 = local_1db8 + 1;
            local_1000 = local_1e60;
            uStack_ff8 = uStack_1e58;
            uStack_ff0 = uStack_1e50;
            uStack_fe8 = uStack_1e48;
            _local_fe0 = auVar11;
          }
          for (; local_1e04 + 3 < local_1a4c; local_1e04 = local_1e04 + 4) {
            local_1208 = local_1d18;
            auVar26 = *local_1d18;
            fStack_1e64 = (float)((ulong)*(undefined8 *)(*local_1d18 + 8) >> 0x20);
            local_1210 = local_1d68;
            local_1e80 = *(undefined8 *)local_1d68;
            uStack_1e78 = *(undefined8 *)(local_1d68 + 2);
            auVar10._12_4_ = fStack_1e64;
            auVar10._0_12_ = auVar26;
            local_f50._0_4_ = auVar26._0_4_;
            local_f50._4_4_ = auVar26._4_4_;
            fStack_f48 = auVar26._8_4_;
            local_f60._0_4_ = (float)local_1e80;
            local_f60._4_4_ = (float)((ulong)local_1e80 >> 0x20);
            uStack_f58._0_4_ = (float)uStack_1e78;
            uStack_f58._4_4_ = (float)((ulong)uStack_1e78 >> 0x20);
            local_1e70 = (float)local_f50._0_4_ + (float)local_f60;
            fStack_1e6c = (float)local_f50._4_4_ + local_f60._4_4_;
            fStack_1e68 = fStack_f48 + (float)uStack_f58;
            fStack_1e64 = fStack_1e64 + uStack_f58._4_4_;
            local_1088 = local_1db8;
            local_10a0 = CONCAT44(fStack_1e6c,local_1e70);
            uStack_1098 = CONCAT44(fStack_1e64,fStack_1e68);
            auVar21._8_8_ = uStack_1098;
            auVar21._0_8_ = local_10a0;
            *(undefined1 (*) [16])*local_1db8 = auVar21;
            local_1d18 = (undefined1 (*) [12])(local_1d18[1] + 4);
            local_1d68 = local_1d68 + 4;
            local_1db8 = (undefined1 (*) [32])(*local_1db8 + 0x10);
            local_f60 = local_1e80;
            uStack_f58 = uStack_1e78;
            _local_f50 = auVar10;
          }
          for (; local_1e04 < local_1a4c; local_1e04 = local_1e04 + 1) {
            *(float *)*local_1db8 = *(float *)*local_1d18 + *local_1d68;
            local_1d18 = (undefined1 (*) [12])(*local_1d18 + 4);
            local_1d68 = local_1d68 + 1;
            local_1db8 = (undefined1 (*) [32])(*local_1db8 + 4);
          }
          local_1950 = local_1d08;
          local_548 = local_17b0;
          local_528 = local_17c0;
          local_508 = local_17d0;
          local_1de0 = local_c90;
          local_1d90 = local_a60;
          local_1d40 = local_a98;
        }
        for (local_1e88 = 2; uVar28 = local_1e88,
            sVar29 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_1a20),
            uVar28 < sVar29; local_1e88 = local_1e88 + 1) {
          local_1e90 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                 (local_1a20,local_1e88);
          for (local_1e94 = 0; local_1e94 < local_1a44; local_1e94 = local_1e94 + 1) {
            local_1960 = &local_1ee8;
            local_9fc = local_1e90->w;
            local_a00 = local_1e90->h;
            local_a04 = local_1e90->d;
            local_a10 = (float *)((long)local_1e90->data +
                                 local_1e90->cstep * (long)local_1e94 * local_1e90->elemsize);
            local_a18 = local_1e90->elemsize;
            local_a1c = local_1e90->elempack;
            local_a28 = local_1e90->allocator;
            local_9f8 = &local_1ee8;
            local_838 = (long)local_9fc * (long)local_a00 * local_a18;
            local_18b0 = &local_1ee8;
            local_17a0 = &local_1ee8;
            local_83c = 0x10;
            local_196c = local_1e94;
            local_196d = 1;
            local_1ee8 = 0;
            local_1ed8 = 0;
            local_1ed0 = 0;
            local_1ebc = 0;
            local_1eb8 = 0;
            local_1eb4 = 0;
            local_1eb0 = 0;
            local_1ee0 = 0;
            local_1650 = &local_1f38;
            local_c2c = local_1a58->w;
            local_c30 = local_1a58->h;
            local_c34 = local_1a58->d;
            local_c40 = (undefined1 (*) [32])
                        ((long)local_1a58->data +
                        local_1a58->cstep * (long)local_1e94 * local_1a58->elemsize);
            local_c48 = local_1a58->elemsize;
            local_c4c = local_1a58->elempack;
            local_c58 = local_1a58->allocator;
            local_c28 = &local_1f38;
            local_798 = (long)local_c2c * (long)local_c30 * local_c48;
            local_79c = 0x10;
            local_1658 = local_1a58;
            local_165c = local_1e94;
            local_165d = 1;
            local_1ea8 = 0;
            local_1ec0 = 0;
            local_15c0 = &local_1f38;
            local_1790 = &local_1f38;
            local_1f38 = 0;
            local_1f28 = 0;
            local_1f20 = 0;
            local_1f10 = 0;
            local_1f0c = 0;
            local_1f08 = 0;
            local_1f04 = 0;
            local_1f00 = 0;
            local_1ef8 = 0;
            local_1f30 = 0;
            local_1ef0 = local_c40;
            local_1ea0 = local_a10;
            for (local_1f3c = 0; local_1f3c + 7 < local_1a4c; local_1f3c = local_1f3c + 8) {
              local_1558 = local_1ef0;
              auVar26 = *(undefined1 (*) [12])*local_1ef0;
              fStack_1f54 = (float)((ulong)*(undefined8 *)(*local_1ef0 + 8) >> 0x20);
              fStack_1f50 = (float)*(undefined8 *)(*local_1ef0 + 0x10);
              fStack_1f4c = (float)((ulong)*(undefined8 *)(*local_1ef0 + 0x10) >> 0x20);
              fStack_1f48 = (float)*(undefined8 *)(*local_1ef0 + 0x18);
              fStack_1f44 = (float)((ulong)*(undefined8 *)(*local_1ef0 + 0x18) >> 0x20);
              local_1560 = local_1ea0;
              local_1f80 = *(undefined8 *)local_1ea0;
              uStack_1f78 = *(undefined8 *)(local_1ea0 + 2);
              uStack_1f70 = *(undefined8 *)(local_1ea0 + 4);
              uStack_1f68 = *(undefined8 *)(local_1ea0 + 6);
              auVar9._12_4_ = fStack_1f54;
              auVar9._0_12_ = auVar26;
              auVar9._16_4_ = fStack_1f50;
              auVar9._20_4_ = fStack_1f4c;
              auVar9._24_4_ = fStack_1f48;
              auVar9._28_4_ = fStack_1f44;
              local_1020._0_4_ = auVar26._0_4_;
              local_1020._4_4_ = auVar26._4_4_;
              fStack_1018 = auVar26._8_4_;
              local_1040._0_4_ = (float)local_1f80;
              local_1040._4_4_ = (float)((ulong)local_1f80 >> 0x20);
              uStack_1038._0_4_ = (float)uStack_1f78;
              uStack_1038._4_4_ = (float)((ulong)uStack_1f78 >> 0x20);
              uStack_1030._0_4_ = (float)uStack_1f70;
              uStack_1030._4_4_ = (float)((ulong)uStack_1f70 >> 0x20);
              uStack_1028._0_4_ = (float)uStack_1f68;
              uStack_1028._4_4_ = (float)((ulong)uStack_1f68 >> 0x20);
              local_1f60 = (float)local_1020._0_4_ + (float)local_1040;
              fStack_1f5c = (float)local_1020._4_4_ + local_1040._4_4_;
              fStack_1f58 = fStack_1018 + (float)uStack_1038;
              fStack_1f54 = fStack_1f54 + uStack_1038._4_4_;
              fStack_1f50 = fStack_1f50 + (float)uStack_1030;
              fStack_1f4c = fStack_1f4c + uStack_1030._4_4_;
              fStack_1f48 = fStack_1f48 + (float)uStack_1028;
              fStack_1f44 = fStack_1f44 + uStack_1028._4_4_;
              local_1328 = local_1ef0;
              local_1360 = CONCAT44(fStack_1f5c,local_1f60);
              uStack_1358 = CONCAT44(fStack_1f54,fStack_1f58);
              uStack_1350 = CONCAT44(fStack_1f4c,fStack_1f50);
              uStack_1348 = CONCAT44(fStack_1f44,fStack_1f48);
              auVar14._8_8_ = uStack_1358;
              auVar14._0_8_ = local_1360;
              auVar14._16_8_ = uStack_1350;
              auVar14._24_8_ = uStack_1348;
              *local_1ef0 = auVar14;
              local_1ea0 = local_1ea0 + 8;
              local_1ef0 = local_1ef0 + 1;
              local_1040 = local_1f80;
              uStack_1038 = uStack_1f78;
              uStack_1030 = uStack_1f70;
              uStack_1028 = uStack_1f68;
              _local_1020 = auVar9;
            }
            for (; local_1f3c + 3 < local_1a4c; local_1f3c = local_1f3c + 4) {
              local_1218 = local_1ef0;
              auVar26 = *(undefined1 (*) [12])*local_1ef0;
              fStack_1f84 = (float)((ulong)*(undefined8 *)(*local_1ef0 + 8) >> 0x20);
              local_1220 = local_1ea0;
              local_1fa0 = *(undefined8 *)local_1ea0;
              uStack_1f98 = *(undefined8 *)(local_1ea0 + 2);
              auVar8._12_4_ = fStack_1f84;
              auVar8._0_12_ = auVar26;
              local_f70._0_4_ = auVar26._0_4_;
              local_f70._4_4_ = auVar26._4_4_;
              fStack_f68 = auVar26._8_4_;
              local_f80._0_4_ = (float)local_1fa0;
              local_f80._4_4_ = (float)((ulong)local_1fa0 >> 0x20);
              uStack_f78._0_4_ = (float)uStack_1f98;
              uStack_f78._4_4_ = (float)((ulong)uStack_1f98 >> 0x20);
              local_1f90 = (float)local_f70._0_4_ + (float)local_f80;
              fStack_1f8c = (float)local_f70._4_4_ + local_f80._4_4_;
              fStack_1f88 = fStack_f68 + (float)uStack_f78;
              fStack_1f84 = fStack_1f84 + uStack_f78._4_4_;
              local_10a8 = local_1ef0;
              local_10c0 = CONCAT44(fStack_1f8c,local_1f90);
              uStack_10b8 = CONCAT44(fStack_1f84,fStack_1f88);
              auVar20._8_8_ = uStack_10b8;
              auVar20._0_8_ = local_10c0;
              *(undefined1 (*) [16])*local_1ef0 = auVar20;
              local_1ea0 = local_1ea0 + 4;
              local_1ef0 = (undefined1 (*) [32])(*local_1ef0 + 0x10);
              local_f80 = local_1fa0;
              uStack_f78 = uStack_1f98;
              _local_f70 = auVar8;
            }
            for (; local_1f3c < local_1a4c; local_1f3c = local_1f3c + 1) {
              *(float *)*local_1ef0 = *local_1ea0 + *(float *)*local_1ef0;
              local_1ea0 = local_1ea0 + 1;
              local_1ef0 = (undefined1 (*) [32])(*local_1ef0 + 4);
            }
            local_1968 = local_1e90;
            local_588 = local_1790;
            local_568 = local_17a0;
            local_1f18 = local_c58;
            local_1ec8 = local_a28;
          }
        }
      }
      else {
        local_1fa8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1a20,1);
        for (local_1fac = 0; local_1fac < local_1a44; local_1fac = local_1fac + 1) {
          local_1978 = &local_2000;
          local_9c4 = local_1a38->w;
          local_9c8 = local_1a38->h;
          local_9cc = local_1a38->d;
          local_9d8 = (undefined1 (*) [24])
                      ((long)local_1a38->data +
                      local_1a38->cstep * (long)local_1fac * local_1a38->elemsize);
          local_9e0 = local_1a38->elemsize;
          local_9e4 = local_1a38->elempack;
          local_9f0 = local_1a38->allocator;
          local_9c0 = &local_2000;
          local_848 = (long)local_9c4 * (long)local_9c8 * local_9e0;
          local_18b8 = &local_2000;
          local_1780 = &local_2000;
          local_1990 = &local_2050;
          local_98c = local_1fa8->w;
          local_990 = local_1fa8->h;
          local_994 = local_1fa8->d;
          local_9a0 = (undefined1 (*) [32])
                      ((long)local_1fa8->data +
                      local_1fa8->cstep * (long)local_1fac * local_1fa8->elemsize);
          local_9a8 = local_1fa8->elemsize;
          local_9ac = local_1fa8->elempack;
          local_9b8 = local_1fa8->allocator;
          local_988 = &local_2050;
          local_858 = (long)local_98c * (long)local_990 * local_9a8;
          local_18c0 = &local_2050;
          local_1770 = &local_2050;
          local_1fc8 = 0;
          local_1fcc = 0;
          local_1fd0 = 0;
          local_1fd4 = 0;
          local_1fe8 = 0;
          local_1ff0 = 0;
          local_1ff8 = 0;
          local_2000 = 0;
          local_84c = 0x10;
          local_85c = 0x10;
          local_1980 = local_1a38;
          local_1984 = local_1fac;
          local_1985 = 1;
          local_199c = local_1fac;
          local_199d = 1;
          local_1fc0 = 0;
          local_1fd8 = 0;
          local_2050 = 0;
          local_2040 = 0;
          local_2038 = 0;
          local_2024 = 0;
          local_2020 = 0;
          local_201c = 0;
          local_2018 = 0;
          local_2048 = 0;
          local_1670 = &local_20a0;
          local_bf4 = local_1a58->w;
          local_bf8 = local_1a58->h;
          local_bfc = local_1a58->d;
          local_c08 = (undefined1 (*) [16])
                      ((long)local_1a58->data +
                      local_1a58->cstep * (long)local_1fac * local_1a58->elemsize);
          local_c10 = local_1a58->elemsize;
          local_c14 = local_1a58->elempack;
          local_c20 = local_1a58->allocator;
          local_bf0 = &local_20a0;
          local_7a8 = (long)local_bf4 * (long)local_bf8 * local_c10;
          local_7ac = 0x10;
          local_1678 = local_1a58;
          local_167c = local_1fac;
          local_167d = 1;
          local_2010 = 0;
          local_2028 = 0;
          local_15c8 = &local_20a0;
          local_1760 = &local_20a0;
          local_20a0 = 0;
          local_2090 = 0;
          local_2088 = 0;
          local_2078 = 0;
          local_2074 = 0;
          local_2070 = 0;
          local_206c = 0;
          local_2068 = 0;
          local_2060 = 0;
          local_2098 = 0;
          local_f18 = (undefined8 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
          local_f20 = 0;
          local_20a4 = *(float *)*local_f18;
          local_f28 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
          local_f30 = 1;
          local_20a8 = *(float *)(*local_f28 + 4);
          local_20ac = 0;
          auVar2 = vinsertps_avx(ZEXT416((uint)local_20a4),ZEXT416((uint)local_20a4),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_20a4),0x20);
          local_1c0 = vinsertps_avx(auVar2,ZEXT416((uint)local_20a4),0x30);
          auVar2 = vinsertps_avx(ZEXT416((uint)local_20a4),ZEXT416((uint)local_20a4),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_20a4),0x20);
          auStack_1b0 = vinsertps_avx(auVar2,ZEXT416((uint)local_20a4),0x30);
          local_20e0 = local_1c0._0_8_;
          uStack_20d8 = local_1c0._8_8_;
          uStack_20d0 = auStack_1b0._0_8_;
          uStack_20c8 = auStack_1b0._8_8_;
          auVar2 = vinsertps_avx(ZEXT416((uint)local_20a8),ZEXT416((uint)local_20a8),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_20a8),0x20);
          auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_20a8),0x30);
          auVar1 = vinsertps_avx(ZEXT416((uint)local_20a8),ZEXT416((uint)local_20a8),0x10);
          auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_20a8),0x20);
          auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_20a8),0x30);
          auVar32._16_16_ = auVar2;
          auVar32._0_16_ = auVar1;
          local_180._0_8_ = auVar1._0_8_;
          local_180._8_8_ = auVar1._8_8_;
          local_180._16_8_ = auVar2._0_8_;
          local_180._24_8_ = auVar2._8_8_;
          local_2100 = local_180._0_8_;
          uStack_20f8 = local_180._8_8_;
          uStack_20f0 = local_180._16_8_;
          uStack_20e8 = local_180._24_8_;
          local_2058 = local_c08;
          local_2008 = local_9a0;
          local_1fb8 = local_9d8;
          for (; local_20ac + 7 < local_1a4c; local_20ac = local_20ac + 8) {
            local_1568 = local_1fb8;
            auVar27 = *local_1fb8;
            uVar4 = *(undefined8 *)local_1fb8[1];
            local_1570 = local_2008;
            local_2140 = *(undefined8 *)*local_2008;
            uStack_2138 = *(undefined8 *)(*local_2008 + 8);
            uStack_2130 = *(undefined8 *)(*local_2008 + 0x10);
            uStack_2128 = *(undefined8 *)(*local_2008 + 0x18);
            local_2120 = auVar27._0_8_;
            uVar5 = local_2120;
            uStack_2118 = auVar27._8_8_;
            uVar6 = uStack_2118;
            uStack_2110 = auVar27._16_8_;
            uVar7 = uStack_2110;
            local_1500._0_4_ = auVar27._0_4_;
            local_1500._4_4_ = auVar27._4_4_;
            uStack_14f8._0_4_ = auVar27._8_4_;
            uStack_14f8._4_4_ = auVar27._12_4_;
            uStack_14f0._0_4_ = auVar27._16_4_;
            uStack_14f0._4_4_ = auVar27._20_4_;
            uStack_14e8._0_4_ = (float)uVar4;
            uStack_14e8._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
            local_1520._0_4_ = local_1c0._0_4_;
            local_1520._4_4_ = local_1c0._4_4_;
            uStack_1518._0_4_ = local_1c0._8_4_;
            uStack_1518._4_4_ = local_1c0._12_4_;
            uStack_1510._0_4_ = auStack_1b0._0_4_;
            uStack_1510._4_4_ = auStack_1b0._4_4_;
            uStack_1508._0_4_ = auStack_1b0._8_4_;
            local_2120._4_4_ = local_1500._4_4_ * local_1520._4_4_;
            local_2120._0_4_ = (float)local_1500 * (float)local_1520;
            uStack_2118._0_4_ = (float)uStack_14f8 * (float)uStack_1518;
            uStack_2118._4_4_ = uStack_14f8._4_4_ * uStack_1518._4_4_;
            uStack_2110._0_4_ = (float)uStack_14f0 * (float)uStack_1510;
            uStack_2110._4_4_ = uStack_14f0._4_4_ * uStack_1510._4_4_;
            auVar27 = _local_2120;
            uStack_2108._0_4_ = (float)uStack_14e8 * (float)uStack_1508;
            uStack_2108._4_4_ = uStack_14e8._4_4_;
            auVar3 = _local_2120;
            local_e80 = local_180._0_8_;
            uStack_e78 = local_180._8_8_;
            uStack_e70 = local_180._16_8_;
            uStack_e68 = local_180._24_8_;
            local_ea0 = local_2120;
            uStack_e98 = uStack_2118;
            uStack_2110 = auVar27._16_8_;
            uStack_e90 = uStack_2110;
            uStack_2108 = auVar3._24_8_;
            uStack_e88 = uStack_2108;
            local_e0 = local_180._0_8_;
            uStack_d8 = local_180._8_8_;
            uStack_d0 = local_180._16_8_;
            uStack_c8 = local_180._24_8_;
            local_100 = local_2120;
            uStack_f8 = uStack_2118;
            uStack_f0 = uStack_2110;
            uStack_e8 = uStack_2108;
            auVar24._16_8_ = local_180._16_8_;
            auVar24._0_16_ = auVar1;
            auVar24._24_8_ = local_180._24_8_;
            auVar23._16_8_ = uStack_2110;
            auVar23._0_16_ = _local_2120;
            auVar23._24_8_ = uStack_2108;
            auVar2 = vfmadd213ps_fma(auVar24,*local_2008,auVar23);
            local_1368 = local_2058;
            local_2120 = auVar2._0_8_;
            local_13a0 = local_2120;
            uStack_2118 = auVar2._8_8_;
            uStack_1398 = uStack_2118;
            uStack_1390 = 0;
            uStack_1388 = 0;
            *(undefined1 (*) [8])*local_2058 = local_2120;
            *(undefined8 *)(*local_2058 + 8) = uStack_2118;
            *(undefined8 *)local_2058[1] = 0;
            *(undefined8 *)(local_2058[1] + 8) = 0;
            local_1fb8 = (undefined1 (*) [24])(local_1fb8[1] + 8);
            local_2008 = local_2008 + 1;
            local_2058 = local_2058 + 2;
            _local_2120 = ZEXT1632(auVar2);
            local_1520 = local_1c0._0_8_;
            uStack_1518 = local_1c0._8_8_;
            uStack_1510 = auStack_1b0._0_8_;
            uStack_1508 = auStack_1b0._8_8_;
            local_1500 = uVar5;
            uStack_14f8 = uVar6;
            uStack_14f0 = uVar7;
            uStack_14e8 = uVar4;
            local_e60 = local_2140;
            uStack_e58 = uStack_2138;
            uStack_e50 = uStack_2130;
            uStack_e48 = uStack_2128;
            local_c0 = local_2140;
            uStack_b8 = uStack_2138;
            uStack_b0 = uStack_2130;
            uStack_a8 = uStack_2128;
          }
          local_2150 = CONCAT44(local_20a4,local_20a4);
          uStack_2148 = CONCAT44(local_20a4,local_20a4);
          local_2160._8_4_ = local_20a8;
          local_2160._0_8_ = CONCAT44(local_20a8,local_20a8);
          local_2160._12_4_ = local_20a8;
          for (; local_20ac + 3 < local_1a4c; local_20ac = local_20ac + 4) {
            local_1228 = local_1fb8;
            uVar4 = *(undefined8 *)*local_1fb8;
            uVar5 = *(undefined8 *)(*local_1fb8 + 8);
            local_1230 = local_2008;
            uVar6 = *(undefined8 *)*local_2008;
            uVar7 = *(undefined8 *)(*local_2008 + 8);
            local_1190._0_4_ = (float)uVar4;
            local_1190._4_4_ = (float)((ulong)uVar4 >> 0x20);
            uStack_1188._0_4_ = (float)uVar5;
            uStack_1188._4_4_ = (float)((ulong)uVar5 >> 0x20);
            local_2170 = CONCAT44(local_1190._4_4_ * local_20a4,(float)local_1190 * local_20a4);
            uStack_2168 = CONCAT44(uStack_1188._4_4_ * local_20a4,(float)uStack_1188 * local_20a4);
            uStack_11b8 = local_2160._8_8_;
            local_11b0._0_4_ = (float)uVar6;
            local_11b0._4_4_ = (float)((ulong)uVar6 >> 0x20);
            uStack_11a8._0_4_ = (float)uVar7;
            uStack_11a8._4_4_ = (float)((ulong)uVar7 >> 0x20);
            local_2180 = (float)local_11b0 * local_20a8;
            fStack_217c = local_11b0._4_4_ * local_20a8;
            fStack_2178 = (float)uStack_11a8 * local_20a8;
            fStack_2174 = uStack_11a8._4_4_ * local_20a8;
            local_f90._4_4_ = fStack_217c;
            local_f90._0_4_ = local_2180;
            local_f90._8_4_ = fStack_2178;
            local_f90._12_4_ = fStack_2174;
            local_fa0 = local_2170;
            uStack_f98 = uStack_2168;
            local_2170 = CONCAT44(fStack_217c + local_1190._4_4_ * local_20a4,
                                  local_2180 + (float)local_1190 * local_20a4);
            uStack_2168 = CONCAT44(fStack_2174 + uStack_1188._4_4_ * local_20a4,
                                   fStack_2178 + (float)uStack_1188 * local_20a4);
            local_10c8 = local_2058;
            local_10e0 = local_2170;
            uStack_10d8 = uStack_2168;
            auVar19._8_8_ = uStack_2168;
            auVar19._0_8_ = local_2170;
            *local_2058 = auVar19;
            local_1fb8 = (undefined1 (*) [24])(*local_1fb8 + 0x10);
            local_2008 = (undefined1 (*) [32])(*local_2008 + 0x10);
            local_2058 = local_2058 + 1;
            local_11c0 = CONCAT44(local_20a8,local_20a8);
            local_11b0 = uVar6;
            uStack_11a8 = uVar7;
            local_11a0 = local_2150;
            uStack_1198 = uStack_2148;
            local_1190 = uVar4;
            uStack_1188 = uVar5;
          }
          for (; local_20ac < local_1a4c; local_20ac = local_20ac + 1) {
            *(float *)*local_2058 =
                 *(float *)*local_1fb8 * local_20a4 + *(float *)*local_2008 * local_20a8;
            local_1fb8 = (undefined1 (*) [24])(*local_1fb8 + 4);
            local_2008 = (undefined1 (*) [32])(*local_2008 + 4);
            local_2058 = (undefined1 (*) [16])(*local_2058 + 4);
          }
          local_1998 = local_1fa8;
          local_f08 = local_20a8;
          local_f04 = local_20a4;
          local_e20 = local_20a8;
          fStack_e1c = local_20a8;
          fStack_e18 = local_20a8;
          fStack_e14 = local_20a8;
          local_e04 = local_20a8;
          local_e00 = local_20a4;
          fStack_dfc = local_20a4;
          fStack_df8 = local_20a4;
          fStack_df4 = local_20a4;
          local_de4 = local_20a4;
          local_5e8 = local_1760;
          local_5c8 = local_1770;
          local_5a8 = local_1780;
          local_1a0 = local_20a4;
          local_19c = local_20a4;
          local_198 = local_20a4;
          local_194 = local_20a4;
          local_190 = local_20a4;
          local_18c = local_20a4;
          local_188 = local_20a4;
          local_184 = local_20a4;
          local_180 = auVar32;
          local_160 = local_20a8;
          local_15c = local_20a8;
          local_158 = local_20a8;
          local_154 = local_20a8;
          local_150 = local_20a8;
          local_14c = local_20a8;
          local_148 = local_20a8;
          local_144 = local_20a8;
          local_2080 = local_c20;
          local_2030 = local_9b8;
          local_1fe0 = local_9f0;
        }
        for (local_2188 = 2; uVar28 = local_2188,
            sVar29 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_1a20),
            uVar28 < sVar29; local_2188 = local_2188 + 1) {
          local_2190 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                 (local_1a20,local_2188);
          for (local_2194 = 0; local_2194 < local_1a44; local_2194 = local_2194 + 1) {
            local_19a8 = &local_21e8;
            local_954 = local_2190->w;
            local_958 = local_2190->h;
            local_95c = local_2190->d;
            local_968 = (undefined1 (*) [32])
                        ((long)local_2190->data +
                        local_2190->cstep * (long)local_2194 * local_2190->elemsize);
            local_970 = local_2190->elemsize;
            local_974 = local_2190->elempack;
            local_980 = local_2190->allocator;
            local_950 = &local_21e8;
            local_868 = (long)local_954 * (long)local_958 * local_970;
            local_18c8 = &local_21e8;
            local_1750 = &local_21e8;
            local_86c = 0x10;
            local_19b4 = local_2194;
            local_19b5 = 1;
            local_21e8 = 0;
            local_21d8 = 0;
            local_21d0 = 0;
            local_21bc = 0;
            local_21b8 = 0;
            local_21b4 = 0;
            local_21b0 = 0;
            local_21e0 = 0;
            local_1690 = &local_2238;
            local_bbc = local_1a58->w;
            local_bc0 = local_1a58->h;
            local_bc4 = local_1a58->d;
            local_bd0 = (undefined1 (*) [32])
                        ((long)local_1a58->data +
                        local_1a58->cstep * (long)local_2194 * local_1a58->elemsize);
            local_bd8 = local_1a58->elemsize;
            local_bdc = local_1a58->elempack;
            local_be8 = local_1a58->allocator;
            local_bb8 = &local_2238;
            local_7b8 = (long)local_bbc * (long)local_bc0 * local_bd8;
            local_7bc = 0x10;
            local_1698 = local_1a58;
            local_169c = local_2194;
            local_169d = 1;
            local_21a8 = 0;
            local_21c0 = 0;
            local_15d0 = &local_2238;
            local_1740 = &local_2238;
            local_2238 = 0;
            local_2228 = 0;
            local_2220 = 0;
            local_2210 = 0;
            local_220c = 0;
            local_2208 = 0;
            local_2204 = 0;
            local_2200 = 0;
            local_21f8 = 0;
            local_2230 = 0;
            local_f38 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
            local_f40 = local_2188;
            local_223c = *(float *)(*local_f38 + local_2188 * 4);
            local_2240 = 0;
            auVar2 = vinsertps_avx(ZEXT416((uint)local_223c),ZEXT416((uint)local_223c),0x10);
            auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_223c),0x20);
            auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_223c),0x30);
            auVar1 = vinsertps_avx(ZEXT416((uint)local_223c),ZEXT416((uint)local_223c),0x10);
            auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_223c),0x20);
            auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_223c),0x30);
            auVar33._16_16_ = auVar2;
            auVar33._0_16_ = auVar1;
            local_140._0_8_ = auVar1._0_8_;
            local_140._8_8_ = auVar1._8_8_;
            local_140._16_8_ = auVar2._0_8_;
            local_140._24_8_ = auVar2._8_8_;
            local_2260 = local_140._0_8_;
            uStack_2258 = local_140._8_8_;
            uStack_2250 = local_140._16_8_;
            uStack_2248 = local_140._24_8_;
            local_21f0 = local_bd0;
            local_21a0 = local_968;
            for (; local_2240 + 7 < local_1a4c; local_2240 = local_2240 + 8) {
              local_1578 = local_21f0;
              auVar27 = *(undefined1 (*) [24])*local_21f0;
              uStack_ee8 = *(undefined8 *)(*local_21f0 + 0x18);
              local_1580 = local_21a0;
              local_22a0 = *(undefined8 *)*local_21a0;
              uStack_2298 = *(undefined8 *)(*local_21a0 + 8);
              uStack_2290 = *(undefined8 *)(*local_21a0 + 0x10);
              uStack_2288 = *(undefined8 *)(*local_21a0 + 0x18);
              local_ee0 = local_140._0_8_;
              uStack_ed8 = local_140._8_8_;
              uStack_ed0 = local_140._16_8_;
              uStack_ec8 = local_140._24_8_;
              local_2280._0_8_ = auVar27._0_8_;
              local_f00 = local_2280._0_8_;
              local_2280._8_8_ = auVar27._8_8_;
              uStack_ef8 = local_2280._8_8_;
              local_2280._16_8_ = auVar27._16_8_;
              uStack_ef0 = local_2280._16_8_;
              local_80 = local_140._0_8_;
              uStack_78 = local_140._8_8_;
              uStack_70 = local_140._16_8_;
              uStack_68 = local_140._24_8_;
              local_a0 = local_2280._0_8_;
              uStack_98 = local_2280._8_8_;
              uStack_90 = local_2280._16_8_;
              auVar25._16_8_ = local_140._16_8_;
              auVar25._0_16_ = auVar1;
              auVar25._24_8_ = local_140._24_8_;
              auVar2 = vfmadd213ps_fma(auVar25,*local_21a0,*local_21f0);
              local_13a8 = local_21f0;
              local_2280._0_8_ = auVar2._0_8_;
              local_13e0 = local_2280._0_8_;
              local_2280._8_8_ = auVar2._8_8_;
              uStack_13d8 = local_2280._8_8_;
              uStack_13d0 = 0;
              uStack_13c8 = 0;
              *(undefined8 *)*local_21f0 = local_2280._0_8_;
              *(undefined8 *)(*local_21f0 + 8) = local_2280._8_8_;
              *(undefined8 *)(*local_21f0 + 0x10) = 0;
              *(undefined8 *)(*local_21f0 + 0x18) = 0;
              local_21a0 = local_21a0 + 1;
              local_21f0 = local_21f0 + 1;
              local_2280 = ZEXT1632(auVar2);
              local_ec0 = local_22a0;
              uStack_eb8 = uStack_2298;
              uStack_eb0 = uStack_2290;
              uStack_ea8 = uStack_2288;
              uStack_88 = uStack_ee8;
              local_60 = local_22a0;
              uStack_58 = uStack_2298;
              uStack_50 = uStack_2290;
              uStack_48 = uStack_2288;
            }
            local_22b0._8_4_ = local_223c;
            local_22b0._0_8_ = CONCAT44(local_223c,local_223c);
            local_22b0._12_4_ = local_223c;
            for (; local_2240 + 3 < local_1a4c; local_2240 = local_2240 + 4) {
              local_1238 = local_21a0;
              uVar4 = *(undefined8 *)*local_21a0;
              uVar5 = *(undefined8 *)(*local_21a0 + 8);
              local_1240 = local_21f0;
              uVar6 = *(undefined8 *)*local_21f0;
              uVar7 = *(undefined8 *)(*local_21f0 + 8);
              uStack_11d8 = local_22b0._8_8_;
              local_11d0._0_4_ = (float)uVar4;
              local_11d0._4_4_ = (float)((ulong)uVar4 >> 0x20);
              uStack_11c8._0_4_ = (float)uVar5;
              uStack_11c8._4_4_ = (float)((ulong)uVar5 >> 0x20);
              local_22c0 = (float)local_11d0 * local_223c;
              fStack_22bc = local_11d0._4_4_ * local_223c;
              fStack_22b8 = (float)uStack_11c8 * local_223c;
              fStack_22b4 = uStack_11c8._4_4_ * local_223c;
              local_fb0._4_4_ = fStack_22bc;
              local_fb0._0_4_ = local_22c0;
              local_fb0._8_4_ = fStack_22b8;
              local_fb0._12_4_ = fStack_22b4;
              local_fc0._0_4_ = (float)uVar6;
              local_fc0._4_4_ = (float)((ulong)uVar6 >> 0x20);
              uStack_fb8._0_4_ = (float)uVar7;
              uStack_fb8._4_4_ = (float)((ulong)uVar7 >> 0x20);
              local_22d0 = CONCAT44(fStack_22bc + local_fc0._4_4_,local_22c0 + (float)local_fc0);
              uStack_22c8 = CONCAT44(fStack_22b4 + uStack_fb8._4_4_,fStack_22b8 + (float)uStack_fb8)
              ;
              local_10e8 = local_21f0;
              local_1100 = local_22d0;
              uStack_10f8 = uStack_22c8;
              auVar18._8_8_ = uStack_22c8;
              auVar18._0_8_ = local_22d0;
              *(undefined1 (*) [16])*local_21f0 = auVar18;
              local_21a0 = (undefined1 (*) [32])(*local_21a0 + 0x10);
              local_21f0 = (undefined1 (*) [32])(*local_21f0 + 0x10);
              local_11e0 = CONCAT44(local_223c,local_223c);
              local_11d0 = uVar4;
              uStack_11c8 = uVar5;
              local_fc0 = uVar6;
              uStack_fb8 = uVar7;
            }
            for (; local_2240 < local_1a4c; local_2240 = local_2240 + 1) {
              *(float *)*local_21f0 = *(float *)*local_21a0 * local_223c + *(float *)*local_21f0;
              local_21a0 = (undefined1 (*) [32])(*local_21a0 + 4);
              local_21f0 = (undefined1 (*) [32])(*local_21f0 + 4);
            }
            local_19b0 = local_2190;
            local_f0c = local_223c;
            local_e40 = local_223c;
            fStack_e3c = local_223c;
            fStack_e38 = local_223c;
            fStack_e34 = local_223c;
            local_e24 = local_223c;
            local_628 = local_1740;
            local_608 = local_1750;
            local_140 = auVar33;
            local_120 = local_223c;
            local_11c = local_223c;
            local_118 = local_223c;
            local_114 = local_223c;
            local_110 = local_223c;
            local_10c = local_223c;
            local_108 = local_223c;
            local_104 = local_223c;
            local_2218 = local_be8;
            local_21c8 = local_980;
          }
        }
      }
    }
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 2) {
      local_22d8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1a20,1);
      for (local_22dc = 0; local_22dc < local_1a44; local_22dc = local_22dc + 1) {
        local_19c0 = &local_2330;
        local_91c = local_1a38->w;
        local_920 = local_1a38->h;
        local_924 = local_1a38->d;
        local_930 = (undefined1 (*) [32])
                    ((long)local_1a38->data +
                    local_1a38->cstep * (long)local_22dc * local_1a38->elemsize);
        local_938 = local_1a38->elemsize;
        local_93c = local_1a38->elempack;
        local_948 = local_1a38->allocator;
        local_918 = &local_2330;
        local_878 = (long)local_91c * (long)local_920 * local_938;
        local_18d0 = &local_2330;
        local_1730 = &local_2330;
        local_19d8 = &local_2380;
        local_8e4 = local_22d8->w;
        local_8e8 = local_22d8->h;
        local_8ec = local_22d8->d;
        local_8f8 = (undefined1 (*) [32])
                    ((long)local_22d8->data +
                    local_22d8->cstep * (long)local_22dc * local_22d8->elemsize);
        local_900 = local_22d8->elemsize;
        local_904 = local_22d8->elempack;
        local_910 = local_22d8->allocator;
        local_8e0 = &local_2380;
        local_888 = (long)local_8e4 * (long)local_8e8 * local_900;
        local_18d8 = &local_2380;
        local_1720 = &local_2380;
        local_16b0 = &local_23d0;
        local_b84 = local_1a58->w;
        local_b88 = local_1a58->h;
        local_b8c = local_1a58->d;
        local_b98 = (undefined1 (*) [32])
                    ((long)local_1a58->data +
                    local_1a58->cstep * (long)local_22dc * local_1a58->elemsize);
        local_ba0 = local_1a58->elemsize;
        local_ba4 = local_1a58->elempack;
        local_bb0 = local_1a58->allocator;
        local_b80 = &local_23d0;
        local_7c8 = (long)local_b84 * (long)local_b88 * local_ba0;
        local_15d8 = &local_23d0;
        local_1710 = &local_23d0;
        local_22f8 = 0;
        local_22fc = 0;
        local_2300 = 0;
        local_2304 = 0;
        local_2318 = 0;
        local_2320 = 0;
        local_2328 = 0;
        local_2330 = 0;
        local_2348 = 0;
        local_234c = 0;
        local_2350 = 0;
        local_2354 = 0;
        local_2368 = 0;
        local_2370 = 0;
        local_2378 = 0;
        local_2380 = 0;
        local_7cc = 0x10;
        local_87c = 0x10;
        local_88c = 0x10;
        local_16b8 = local_1a58;
        local_16bc = local_22dc;
        local_16bd = 1;
        local_19c8 = local_1a38;
        local_19cc = local_22dc;
        local_19cd = 1;
        local_19e0 = local_22d8;
        local_19e4 = local_22dc;
        local_19e5 = 1;
        local_22f0 = 0;
        local_2308 = 0;
        local_2340 = 0;
        local_2358 = 0;
        local_23d0 = 0;
        local_23c0 = 0;
        local_23b8 = 0;
        local_23a8 = 0;
        local_23a4 = 0;
        local_23a0 = 0;
        local_239c = 0;
        local_2398 = 0;
        local_2390 = 0;
        local_23c8 = 0;
        local_2388 = local_b98;
        local_2338 = local_8f8;
        local_22e8 = local_930;
        for (local_23d4 = 0; local_23d4 + 7 < local_1a4c; local_23d4 = local_23d4 + 8) {
          local_1588 = local_22e8;
          auVar27 = *(undefined1 (*) [24])*local_22e8;
          uStack_d68 = *(undefined8 *)(*local_22e8 + 0x18);
          local_1590 = local_2338;
          local_2420 = *(undefined8 *)*local_2338;
          uStack_2418 = *(undefined8 *)(*local_2338 + 8);
          uStack_2410 = *(undefined8 *)(*local_2338 + 0x10);
          uStack_2408 = *(undefined8 *)(*local_2338 + 0x18);
          local_2400._0_8_ = auVar27._0_8_;
          local_d80 = local_2400._0_8_;
          local_2400._8_8_ = auVar27._8_8_;
          uStack_d78 = local_2400._8_8_;
          local_2400._16_8_ = auVar27._16_8_;
          uStack_d70 = local_2400._16_8_;
          local_2400 = vmaxps_avx(*local_22e8,*local_2338);
          local_13e8 = local_2388;
          local_1420 = local_2400._0_8_;
          uStack_1418 = local_2400._8_8_;
          uStack_1410 = local_2400._16_8_;
          uStack_1408 = local_2400._24_8_;
          *local_2388 = local_2400;
          local_22e8 = local_22e8 + 1;
          local_2338 = local_2338 + 1;
          local_2388 = local_2388 + 1;
          local_da0 = local_2420;
          uStack_d98 = uStack_2418;
          uStack_d90 = uStack_2410;
          uStack_d88 = uStack_2408;
        }
        for (; local_688 = local_1710, local_668 = local_1720, local_648 = local_1730,
            local_23b0 = local_bb0, local_2360 = local_910, local_2310 = local_948,
            local_23d4 + 3 < local_1a4c; local_23d4 = local_23d4 + 4) {
          local_1248 = local_22e8;
          local_d20 = *(undefined8 *)*local_22e8;
          uStack_d18 = *(undefined8 *)(*local_22e8 + 8);
          local_1250 = local_2338;
          local_2440 = *(undefined8 *)*local_2338;
          uStack_2438 = *(undefined8 *)(*local_2338 + 8);
          local_2430 = vmaxps_avx(*(undefined1 (*) [16])*local_22e8,
                                  *(undefined1 (*) [16])*local_2338);
          local_1108 = local_2388;
          local_1120 = local_2430._0_8_;
          uStack_1118 = local_2430._8_8_;
          *(undefined1 (*) [16])*local_2388 = local_2430;
          local_22e8 = (undefined1 (*) [32])(*local_22e8 + 0x10);
          local_2338 = (undefined1 (*) [32])(*local_2338 + 0x10);
          local_2388 = (undefined1 (*) [32])(*local_2388 + 0x10);
          local_d30 = local_2440;
          uStack_d28 = uStack_2438;
        }
        for (; local_23d4 < local_1a4c; local_23d4 = local_23d4 + 1) {
          pfVar30 = std::max<float>((float *)local_22e8,(float *)local_2338);
          *(float *)*local_2388 = *pfVar30;
          local_22e8 = (undefined1 (*) [32])(*local_22e8 + 4);
          local_2338 = (undefined1 (*) [32])(*local_2338 + 4);
          local_2388 = (undefined1 (*) [32])(*local_2388 + 4);
        }
      }
      for (local_2448 = 2; uVar28 = local_2448,
          sVar29 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_1a20),
          uVar28 < sVar29; local_2448 = local_2448 + 1) {
        local_2450 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                               (local_1a20,local_2448);
        for (local_2454 = 0; local_2454 < local_1a44; local_2454 = local_2454 + 1) {
          local_19f0 = &local_24a8;
          local_8ac = local_2450->w;
          local_8b0 = local_2450->h;
          local_8b4 = local_2450->d;
          local_8c0 = (undefined1 (*) [32])
                      ((long)local_2450->data +
                      local_2450->cstep * (long)local_2454 * local_2450->elemsize);
          local_8c8 = local_2450->elemsize;
          local_8cc = local_2450->elempack;
          local_8d8 = local_2450->allocator;
          local_8a8 = &local_24a8;
          local_898 = (long)local_8ac * (long)local_8b0 * local_8c8;
          local_18e0 = &local_24a8;
          local_1700 = &local_24a8;
          local_16d0 = &local_24f8;
          local_b4c = local_1a58->w;
          local_b50 = local_1a58->h;
          local_b54 = local_1a58->d;
          local_b60 = (undefined1 (*) [32])
                      ((long)local_1a58->data +
                      local_1a58->cstep * (long)local_2454 * local_1a58->elemsize);
          local_b68 = local_1a58->elemsize;
          local_b6c = local_1a58->elempack;
          local_b78 = local_1a58->allocator;
          local_b48 = &local_24f8;
          local_7d8 = (long)local_b4c * (long)local_b50 * local_b68;
          local_15e0 = &local_24f8;
          local_16f0 = &local_24f8;
          local_2470 = 0;
          local_2474 = 0;
          local_2478 = 0;
          local_247c = 0;
          local_2490 = 0;
          local_2498 = 0;
          local_24a0 = 0;
          local_24a8 = 0;
          local_7dc = 0x10;
          local_89c = 0x10;
          local_16d8 = local_1a58;
          local_16dc = local_2454;
          local_16dd = 1;
          local_19f8 = local_2450;
          local_19fc = local_2454;
          local_19fd = 1;
          local_2468 = 0;
          local_2480 = 0;
          local_24f8 = 0;
          local_24e8 = 0;
          local_24e0 = 0;
          local_24d0 = 0;
          local_24cc = 0;
          local_24c8 = 0;
          local_24c4 = 0;
          local_24c0 = 0;
          local_24b8 = 0;
          local_24f0 = 0;
          local_24b0 = local_b60;
          local_2460 = local_8c0;
          for (local_24fc = 0; local_24fc + 7 < local_1a4c; local_24fc = local_24fc + 8) {
            local_1598 = local_24b0;
            auVar27 = *(undefined1 (*) [24])*local_24b0;
            uStack_da8 = *(undefined8 *)(*local_24b0 + 0x18);
            local_15a0 = local_2460;
            local_de0 = *(undefined8 *)*local_2460;
            uStack_dd8 = *(undefined8 *)(*local_2460 + 8);
            uStack_dd0 = *(undefined8 *)(*local_2460 + 0x10);
            uStack_dc8 = *(undefined8 *)(*local_2460 + 0x18);
            local_2520 = auVar27._0_8_;
            local_dc0 = local_2520;
            uStack_2518 = auVar27._8_8_;
            uStack_db8 = uStack_2518;
            uStack_2510 = auVar27._16_8_;
            uStack_db0 = uStack_2510;
            auVar3 = vmaxps_avx(*local_24b0,*local_2460);
            local_1428 = local_24b0;
            local_2520 = auVar3._0_8_;
            local_1460 = local_2520;
            uStack_2518 = auVar3._8_8_;
            uStack_1458 = uStack_2518;
            uStack_2510 = auVar3._16_8_;
            uStack_1450 = uStack_2510;
            uStack_2508 = auVar3._24_8_;
            uStack_1448 = uStack_2508;
            *local_24b0 = auVar3;
            local_2460 = local_2460 + 1;
            local_24b0 = local_24b0 + 1;
          }
          for (; local_6c8 = local_16f0, local_6a8 = local_1700, local_24d8 = local_b78,
              local_2488 = local_8d8, local_24fc + 3 < local_1a4c; local_24fc = local_24fc + 4) {
            local_1258 = local_24b0;
            local_d40 = *(undefined8 *)*local_24b0;
            uStack_d38 = *(undefined8 *)(*local_24b0 + 8);
            local_1260 = local_2460;
            local_d50 = *(undefined8 *)*local_2460;
            uStack_d48 = *(undefined8 *)(*local_2460 + 8);
            auVar2 = vmaxps_avx(*(undefined1 (*) [16])*local_24b0,*(undefined1 (*) [16])*local_2460)
            ;
            local_1128 = local_24b0;
            local_2550 = auVar2._0_8_;
            local_1140 = local_2550;
            uStack_2548 = auVar2._8_8_;
            uStack_1138 = uStack_2548;
            *(undefined1 (*) [16])*local_24b0 = auVar2;
            local_2460 = (undefined1 (*) [32])(*local_2460 + 0x10);
            local_24b0 = (undefined1 (*) [32])(*local_24b0 + 0x10);
          }
          for (; local_24fc < local_1a4c; local_24fc = local_24fc + 1) {
            pfVar30 = std::max<float>((float *)local_2460,(float *)local_24b0);
            *(float *)*local_24b0 = *pfVar30;
            local_2460 = (undefined1 (*) [32])(*local_2460 + 4);
            local_24b0 = (undefined1 (*) [32])(*local_24b0 + 4);
          }
        }
      }
    }
    local_1a0c = 0;
  }
  return local_1a0c;
}

Assistant:

int Eltwise_x86_fma::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;
    int size = w * h * elempack;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_mul_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_mul_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_mul_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = *ptr * *ptr1;

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_mul_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr *= *ptr;

                    ptr++;
                    outptr++;
                }
            }
        }
    }
    if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_add_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_add_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_add_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr + *ptr1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_p, _p1);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_add_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_add_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                const float coeff0 = coeffs[0];
                const float coeff1 = coeffs[1];

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _coeff0_avx512 = _mm512_set1_ps(coeff0);
                __m512 _coeff1_avx512 = _mm512_set1_ps(coeff1);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_mul_ps(_p, _coeff0_avx512);
                    _p = _mm512_fmadd_ps(_p1, _coeff1_avx512, _p);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                __m256 _coeff0_avx = _mm256_set1_ps(coeff0);
                __m256 _coeff1_avx = _mm256_set1_ps(coeff1);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_mul_ps(_p, _coeff0_avx);
                    _p = _mm256_comp_fmadd_ps(_p1, _coeff1_avx, _p);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                __m128 _coeff0 = _mm_set1_ps(coeff0);
                __m128 _coeff1 = _mm_set1_ps(coeff1);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_mul_ps(_p, _coeff0);
                    _p1 = _mm_mul_ps(_p1, _coeff1);
                    _p = _mm_add_ps(_p1, _p);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr * coeff0 + *ptr1 * coeff1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    const float coeff = coeffs[b];

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _coeff_avx512 = _mm512_set1_ps(coeff);
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_fmadd_ps(_p1, _coeff_avx512, _p);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _coeff_avx = _mm256_set1_ps(coeff);
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p1, _coeff_avx, _p);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    __m128 _coeff = _mm_set1_ps(coeff);
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p1 = _mm_load_ps(ptr);
                        __m128 _p = _mm_load_ps(outptr);
                        _p1 = _mm_mul_ps(_p1, _coeff);
                        _p = _mm_add_ps(_p1, _p);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr * coeff;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
    }
    if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_max_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_max_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_max_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = std::max(*ptr, *ptr1);

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_max_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_max_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_max_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = std::max(*ptr, *outptr);

                    ptr++;
                    outptr++;
                }
            }
        }
    }

    return 0;
}